

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Primitive PVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined3 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  bool bVar27;
  undefined8 uVar28;
  RTCFeatureFlags RVar29;
  undefined1 auVar30 [16];
  undefined6 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  RTCFilterFunctionN p_Var58;
  RayHitK<4> *pRVar59;
  int iVar60;
  RTCIntersectArguments *pRVar61;
  RTCIntersectArguments *pRVar62;
  ulong uVar63;
  long lVar64;
  bool bVar65;
  uint uVar66;
  uint uVar67;
  int iVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  float t1;
  undefined2 uVar100;
  float fVar72;
  float fVar101;
  float fVar102;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar123;
  float fVar124;
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar142;
  float fVar143;
  vfloat4 v;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar144;
  float fVar160;
  float fVar162;
  vfloat4 v_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  float fVar165;
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar174;
  float fVar198;
  float fVar199;
  vfloat_impl<4> p00;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar202;
  float fVar203;
  float fVar213;
  float fVar215;
  undefined1 auVar204 [16];
  float fVar214;
  float fVar216;
  float fVar217;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar230;
  float fVar234;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar241;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar253;
  float fVar265;
  float fVar266;
  undefined1 auVar254 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar267;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar268;
  float fVar277;
  float fVar278;
  vfloat4 a;
  undefined1 auVar269 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar279;
  float fVar280;
  float fVar289;
  float fVar291;
  vfloat4 a_2;
  float fVar293;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  float fVar295;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar296;
  float fVar297;
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar302 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar323;
  float fVar324;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_548;
  float fStack_530;
  float fStack_52c;
  undefined8 local_518;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e8;
  Primitive *local_3e0;
  ulong local_3d8;
  long local_3d0;
  RTCFilterFunctionNArguments local_3c8;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  uint auStack_308 [4];
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  undefined1 local_e8 [12];
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 auStack_58 [5];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar99;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar158 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  
  PVar12 = prim[1];
  uVar54 = (ulong)(byte)PVar12;
  lVar19 = uVar54 * 0x25;
  pPVar4 = prim + lVar19 + 6;
  fVar143 = *(float *)(pPVar4 + 0xc);
  fVar144 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar143;
  fVar160 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar143;
  fVar162 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar143;
  fVar125 = *(float *)(ray + k * 4 + 0x40) * fVar143;
  fVar142 = *(float *)(ray + k * 4 + 0x50) * fVar143;
  fVar143 = *(float *)(ray + k * 4 + 0x60) * fVar143;
  uVar13 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar258._8_4_ = 0;
  auVar258._0_8_ = uVar55;
  auVar258._12_2_ = uVar100;
  auVar258._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar127._12_4_ = auVar258._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar55;
  auVar127._10_2_ = uVar100;
  auVar73._10_6_ = auVar127._10_6_;
  auVar73._8_2_ = uVar100;
  auVar73._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar32._4_8_ = auVar73._8_8_;
  auVar32._2_2_ = uVar100;
  auVar32._0_2_ = uVar100;
  fVar312 = (float)((int)sVar71 >> 8);
  fVar318 = (float)(auVar32._0_4_ >> 0x18);
  fVar320 = (float)(auVar73._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar55;
  auVar106._12_2_ = uVar100;
  auVar106._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar55;
  auVar105._10_2_ = uVar100;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar100;
  auVar104._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar33._4_8_ = auVar104._8_8_;
  auVar33._2_2_ = uVar100;
  auVar33._0_2_ = uVar100;
  fVar165 = (float)((int)sVar71 >> 8);
  fVar169 = (float)(auVar33._0_4_ >> 0x18);
  fVar171 = (float)(auVar104._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar55;
  auVar109._12_2_ = uVar100;
  auVar109._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar55;
  auVar108._10_2_ = uVar100;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar100;
  auVar107._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar34._4_8_ = auVar107._8_8_;
  auVar34._2_2_ = uVar100;
  auVar34._0_2_ = uVar100;
  fVar202 = (float)((int)sVar71 >> 8);
  fVar213 = (float)(auVar34._0_4_ >> 0x18);
  fVar215 = (float)(auVar107._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar55;
  auVar112._12_2_ = uVar100;
  auVar112._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar55;
  auVar111._10_2_ = uVar100;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar100;
  auVar110._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar35._4_8_ = auVar110._8_8_;
  auVar35._2_2_ = uVar100;
  auVar35._0_2_ = uVar100;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar101 = (float)(auVar35._0_4_ >> 0x18);
  fVar102 = (float)(auVar110._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar55;
  auVar177._12_2_ = uVar100;
  auVar177._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar55;
  auVar176._10_2_ = uVar100;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar100;
  auVar175._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar36._4_8_ = auVar175._8_8_;
  auVar36._2_2_ = uVar100;
  auVar36._0_2_ = uVar100;
  fVar218 = (float)((int)sVar71 >> 8);
  fVar230 = (float)(auVar36._0_4_ >> 0x18);
  fVar234 = (float)(auVar175._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar54 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar55;
  auVar180._12_2_ = uVar100;
  auVar180._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar55;
  auVar179._10_2_ = uVar100;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar100;
  auVar178._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar37._4_8_ = auVar178._8_8_;
  auVar37._2_2_ = uVar100;
  auVar37._0_2_ = uVar100;
  fVar253 = (float)((int)sVar71 >> 8);
  fVar265 = (float)(auVar37._0_4_ >> 0x18);
  fVar266 = (float)(auVar178._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar55;
  auVar183._12_2_ = uVar100;
  auVar183._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar55;
  auVar182._10_2_ = uVar100;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar100;
  auVar181._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar38._4_8_ = auVar181._8_8_;
  auVar38._2_2_ = uVar100;
  auVar38._0_2_ = uVar100;
  fVar241 = (float)((int)sVar71 >> 8);
  fVar251 = (float)(auVar38._0_4_ >> 0x18);
  fVar252 = (float)(auVar181._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar55;
  auVar186._12_2_ = uVar100;
  auVar186._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar55;
  auVar185._10_2_ = uVar100;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar100;
  auVar184._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar39._4_8_ = auVar184._8_8_;
  auVar39._2_2_ = uVar100;
  auVar39._0_2_ = uVar100;
  fVar268 = (float)((int)sVar71 >> 8);
  fVar277 = (float)(auVar39._0_4_ >> 0x18);
  fVar278 = (float)(auVar184._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar55;
  auVar189._12_2_ = uVar100;
  auVar189._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar55;
  auVar188._10_2_ = uVar100;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar100;
  auVar187._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar40._4_8_ = auVar187._8_8_;
  auVar40._2_2_ = uVar100;
  auVar40._0_2_ = uVar100;
  fVar103 = (float)((int)sVar71 >> 8);
  fVar123 = (float)(auVar40._0_4_ >> 0x18);
  fVar124 = (float)(auVar187._8_4_ >> 0x18);
  fVar296 = fVar125 * fVar312 + fVar142 * fVar165 + fVar143 * fVar202;
  fVar306 = fVar125 * fVar318 + fVar142 * fVar169 + fVar143 * fVar213;
  fVar308 = fVar125 * fVar320 + fVar142 * fVar171 + fVar143 * fVar215;
  fVar310 = fVar125 * (float)(auVar127._12_4_ >> 0x18) +
            fVar142 * (float)(auVar105._12_4_ >> 0x18) + fVar143 * (float)(auVar108._12_4_ >> 0x18);
  fVar279 = fVar125 * fVar72 + fVar142 * fVar218 + fVar143 * fVar253;
  fVar289 = fVar125 * fVar101 + fVar142 * fVar230 + fVar143 * fVar265;
  fVar291 = fVar125 * fVar102 + fVar142 * fVar234 + fVar143 * fVar266;
  fVar293 = fVar125 * (float)(auVar111._12_4_ >> 0x18) +
            fVar142 * (float)(auVar176._12_4_ >> 0x18) + fVar143 * (float)(auVar179._12_4_ >> 0x18);
  fVar174 = fVar125 * fVar241 + fVar142 * fVar268 + fVar143 * fVar103;
  fVar198 = fVar125 * fVar251 + fVar142 * fVar277 + fVar143 * fVar123;
  fVar199 = fVar125 * fVar252 + fVar142 * fVar278 + fVar143 * fVar124;
  fVar125 = fVar125 * (float)(auVar182._12_4_ >> 0x18) +
            fVar142 * (float)(auVar185._12_4_ >> 0x18) + fVar143 * (float)(auVar188._12_4_ >> 0x18);
  fVar313 = fVar312 * fVar144 + fVar165 * fVar160 + fVar202 * fVar162;
  fVar318 = fVar318 * fVar144 + fVar169 * fVar160 + fVar213 * fVar162;
  fVar320 = fVar320 * fVar144 + fVar171 * fVar160 + fVar215 * fVar162;
  fVar321 = (float)(auVar127._12_4_ >> 0x18) * fVar144 +
            (float)(auVar105._12_4_ >> 0x18) * fVar160 + (float)(auVar108._12_4_ >> 0x18) * fVar162;
  fVar253 = fVar72 * fVar144 + fVar218 * fVar160 + fVar253 * fVar162;
  fVar265 = fVar101 * fVar144 + fVar230 * fVar160 + fVar265 * fVar162;
  fVar266 = fVar102 * fVar144 + fVar234 * fVar160 + fVar266 * fVar162;
  fVar312 = (float)(auVar111._12_4_ >> 0x18) * fVar144 +
            (float)(auVar176._12_4_ >> 0x18) * fVar160 + (float)(auVar179._12_4_ >> 0x18) * fVar162;
  fVar241 = fVar144 * fVar241 + fVar160 * fVar268 + fVar162 * fVar103;
  fVar251 = fVar144 * fVar251 + fVar160 * fVar277 + fVar162 * fVar123;
  fVar252 = fVar144 * fVar252 + fVar160 * fVar278 + fVar162 * fVar124;
  fVar268 = fVar144 * (float)(auVar182._12_4_ >> 0x18) +
            fVar160 * (float)(auVar185._12_4_ >> 0x18) + fVar162 * (float)(auVar188._12_4_ >> 0x18);
  fVar143 = (float)DAT_01ff1d40;
  fVar72 = DAT_01ff1d40._4_4_;
  fVar101 = DAT_01ff1d40._8_4_;
  fVar102 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar143 <= ABS(fVar296));
  uVar67 = -(uint)(fVar72 <= ABS(fVar306));
  uVar69 = -(uint)(fVar101 <= ABS(fVar308));
  uVar70 = -(uint)(fVar102 <= ABS(fVar310));
  auVar298._0_4_ = (uint)fVar296 & uVar66;
  auVar298._4_4_ = (uint)fVar306 & uVar67;
  auVar298._8_4_ = (uint)fVar308 & uVar69;
  auVar298._12_4_ = (uint)fVar310 & uVar70;
  auVar145._0_4_ = ~uVar66 & (uint)fVar143;
  auVar145._4_4_ = ~uVar67 & (uint)fVar72;
  auVar145._8_4_ = ~uVar69 & (uint)fVar101;
  auVar145._12_4_ = ~uVar70 & (uint)fVar102;
  auVar145 = auVar145 | auVar298;
  uVar66 = -(uint)(fVar143 <= ABS(fVar279));
  uVar67 = -(uint)(fVar72 <= ABS(fVar289));
  uVar69 = -(uint)(fVar101 <= ABS(fVar291));
  uVar70 = -(uint)(fVar102 <= ABS(fVar293));
  auVar281._0_4_ = (uint)fVar279 & uVar66;
  auVar281._4_4_ = (uint)fVar289 & uVar67;
  auVar281._8_4_ = (uint)fVar291 & uVar69;
  auVar281._12_4_ = (uint)fVar293 & uVar70;
  auVar204._0_4_ = ~uVar66 & (uint)fVar143;
  auVar204._4_4_ = ~uVar67 & (uint)fVar72;
  auVar204._8_4_ = ~uVar69 & (uint)fVar101;
  auVar204._12_4_ = ~uVar70 & (uint)fVar102;
  auVar204 = auVar204 | auVar281;
  uVar66 = -(uint)(fVar143 <= ABS(fVar174));
  uVar67 = -(uint)(fVar72 <= ABS(fVar198));
  uVar69 = -(uint)(fVar101 <= ABS(fVar199));
  uVar70 = -(uint)(fVar102 <= ABS(fVar125));
  auVar190._0_4_ = (uint)fVar174 & uVar66;
  auVar190._4_4_ = (uint)fVar198 & uVar67;
  auVar190._8_4_ = (uint)fVar199 & uVar69;
  auVar190._12_4_ = (uint)fVar125 & uVar70;
  auVar222._0_4_ = ~uVar66 & (uint)fVar143;
  auVar222._4_4_ = ~uVar67 & (uint)fVar72;
  auVar222._8_4_ = ~uVar69 & (uint)fVar101;
  auVar222._12_4_ = ~uVar70 & (uint)fVar102;
  auVar222 = auVar222 | auVar190;
  auVar73 = rcpps(_DAT_01ff1d40,auVar145);
  fVar143 = auVar73._0_4_;
  fVar102 = auVar73._4_4_;
  fVar165 = auVar73._8_4_;
  fVar218 = auVar73._12_4_;
  fVar143 = (1.0 - auVar145._0_4_ * fVar143) * fVar143 + fVar143;
  fVar102 = (1.0 - auVar145._4_4_ * fVar102) * fVar102 + fVar102;
  fVar165 = (1.0 - auVar145._8_4_ * fVar165) * fVar165 + fVar165;
  fVar218 = (1.0 - auVar145._12_4_ * fVar218) * fVar218 + fVar218;
  auVar73 = rcpps(auVar73,auVar204);
  fVar72 = auVar73._0_4_;
  fVar103 = auVar73._4_4_;
  fVar169 = auVar73._8_4_;
  fVar230 = auVar73._12_4_;
  fVar72 = (1.0 - auVar204._0_4_ * fVar72) * fVar72 + fVar72;
  fVar103 = (1.0 - auVar204._4_4_ * fVar103) * fVar103 + fVar103;
  fVar169 = (1.0 - auVar204._8_4_ * fVar169) * fVar169 + fVar169;
  fVar230 = (1.0 - auVar204._12_4_ * fVar230) * fVar230 + fVar230;
  auVar73 = rcpps(auVar73,auVar222);
  fVar101 = auVar73._0_4_;
  fVar123 = auVar73._4_4_;
  fVar171 = auVar73._8_4_;
  fVar234 = auVar73._12_4_;
  fVar101 = (1.0 - auVar222._0_4_ * fVar101) * fVar101 + fVar101;
  fVar123 = (1.0 - auVar222._4_4_ * fVar123) * fVar123 + fVar123;
  fVar171 = (1.0 - auVar222._8_4_ * fVar171) * fVar171 + fVar171;
  fVar234 = (1.0 - auVar222._12_4_ * fVar234) * fVar234 + fVar234;
  fVar277 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar19 + 0x16)) *
            *(float *)(prim + lVar19 + 0x1a);
  uVar55 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar100 = (undefined2)(uVar55 >> 0x30);
  auVar326._8_4_ = 0;
  auVar326._0_8_ = uVar55;
  auVar326._12_2_ = uVar100;
  auVar326._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar55 >> 0x20);
  auVar129._12_4_ = auVar326._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar55;
  auVar129._10_2_ = uVar100;
  auVar74._10_6_ = auVar129._10_6_;
  auVar74._8_2_ = uVar100;
  auVar74._0_8_ = uVar55;
  uVar100 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar74._8_8_;
  auVar41._2_2_ = uVar100;
  auVar41._0_2_ = uVar100;
  fVar124 = (float)(auVar41._0_4_ >> 0x10);
  fVar174 = (float)(auVar74._8_4_ >> 0x10);
  uVar56 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar100 = (undefined2)(uVar56 >> 0x30);
  auVar148._8_4_ = 0;
  auVar148._0_8_ = uVar56;
  auVar148._12_2_ = uVar100;
  auVar148._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar56 >> 0x20);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._8_2_ = 0;
  auVar147._0_8_ = uVar56;
  auVar147._10_2_ = uVar100;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = uVar100;
  auVar146._0_8_ = uVar56;
  uVar100 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar146._8_8_;
  auVar42._2_2_ = uVar100;
  auVar42._0_2_ = uVar100;
  uVar57 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar100 = (undefined2)(uVar57 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar57;
  auVar77._12_2_ = uVar100;
  auVar77._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar57 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar57;
  auVar76._10_2_ = uVar100;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar100;
  auVar75._0_8_ = uVar57;
  uVar100 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar75._8_8_;
  auVar43._2_2_ = uVar100;
  auVar43._0_2_ = uVar100;
  fVar125 = (float)(auVar43._0_4_ >> 0x10);
  fVar198 = (float)(auVar75._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar100 = (undefined2)(uVar5 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar5;
  auVar225._12_2_ = uVar100;
  auVar225._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar5 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar5;
  auVar224._10_2_ = uVar100;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar100;
  auVar223._0_8_ = uVar5;
  uVar100 = (undefined2)(uVar5 >> 0x10);
  auVar44._4_8_ = auVar223._8_8_;
  auVar44._2_2_ = uVar100;
  auVar44._0_2_ = uVar100;
  uVar6 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar100 = (undefined2)(uVar6 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar6;
  auVar80._12_2_ = uVar100;
  auVar80._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar6 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar6;
  auVar79._10_2_ = uVar100;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar100;
  auVar78._0_8_ = uVar6;
  uVar100 = (undefined2)(uVar6 >> 0x10);
  auVar45._4_8_ = auVar78._8_8_;
  auVar45._2_2_ = uVar100;
  auVar45._0_2_ = uVar100;
  fVar142 = (float)(auVar45._0_4_ >> 0x10);
  fVar199 = (float)(auVar78._8_4_ >> 0x10);
  uVar63 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar7 = *(ulong *)(prim + uVar54 * 2 + uVar63 + 6);
  uVar100 = (undefined2)(uVar7 >> 0x30);
  auVar256._8_4_ = 0;
  auVar256._0_8_ = uVar7;
  auVar256._12_2_ = uVar100;
  auVar256._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar7 >> 0x20);
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar7;
  auVar255._10_2_ = uVar100;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._8_2_ = uVar100;
  auVar254._0_8_ = uVar7;
  uVar100 = (undefined2)(uVar7 >> 0x10);
  auVar46._4_8_ = auVar254._8_8_;
  auVar46._2_2_ = uVar100;
  auVar46._0_2_ = uVar100;
  uVar63 = *(ulong *)(prim + uVar63 + 6);
  uVar100 = (undefined2)(uVar63 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar63;
  auVar83._12_2_ = uVar100;
  auVar83._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar63 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar63;
  auVar82._10_2_ = uVar100;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar100;
  auVar81._0_8_ = uVar63;
  uVar100 = (undefined2)(uVar63 >> 0x10);
  auVar47._4_8_ = auVar81._8_8_;
  auVar47._2_2_ = uVar100;
  auVar47._0_2_ = uVar100;
  fVar144 = (float)(auVar47._0_4_ >> 0x10);
  fVar202 = (float)(auVar81._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar100 = (undefined2)(uVar8 >> 0x30);
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar8;
  auVar271._12_2_ = uVar100;
  auVar271._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar8 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar8;
  auVar270._10_2_ = uVar100;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar100;
  auVar269._0_8_ = uVar8;
  uVar100 = (undefined2)(uVar8 >> 0x10);
  auVar48._4_8_ = auVar269._8_8_;
  auVar48._2_2_ = uVar100;
  auVar48._0_2_ = uVar100;
  uVar9 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar100 = (undefined2)(uVar9 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar9;
  auVar86._12_2_ = uVar100;
  auVar86._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar9 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar9;
  auVar85._10_2_ = uVar100;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar100;
  auVar84._0_8_ = uVar9;
  uVar100 = (undefined2)(uVar9 >> 0x10);
  auVar49._4_8_ = auVar84._8_8_;
  auVar49._2_2_ = uVar100;
  auVar49._0_2_ = uVar100;
  fVar160 = (float)(auVar49._0_4_ >> 0x10);
  fVar213 = (float)(auVar84._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar12 * 0x20 + 6);
  uVar100 = (undefined2)(uVar10 >> 0x30);
  auVar284._8_4_ = 0;
  auVar284._0_8_ = uVar10;
  auVar284._12_2_ = uVar100;
  auVar284._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar10 >> 0x20);
  auVar283._12_4_ = auVar284._12_4_;
  auVar283._8_2_ = 0;
  auVar283._0_8_ = uVar10;
  auVar283._10_2_ = uVar100;
  auVar282._10_6_ = auVar283._10_6_;
  auVar282._8_2_ = uVar100;
  auVar282._0_8_ = uVar10;
  uVar100 = (undefined2)(uVar10 >> 0x10);
  auVar50._4_8_ = auVar282._8_8_;
  auVar50._2_2_ = uVar100;
  auVar50._0_2_ = uVar100;
  uVar11 = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar54) + 6);
  uVar100 = (undefined2)(uVar11 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar11;
  auVar89._12_2_ = uVar100;
  auVar89._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar11 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar11;
  auVar88._10_2_ = uVar100;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar100;
  auVar87._0_8_ = uVar11;
  uVar100 = (undefined2)(uVar11 >> 0x10);
  auVar51._4_8_ = auVar87._8_8_;
  auVar51._2_2_ = uVar100;
  auVar51._0_2_ = uVar100;
  fVar162 = (float)(auVar51._0_4_ >> 0x10);
  fVar215 = (float)(auVar87._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar301._8_4_ = 0;
  auVar301._0_8_ = uVar54;
  auVar301._12_2_ = uVar100;
  auVar301._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar300._12_4_ = auVar301._12_4_;
  auVar300._8_2_ = 0;
  auVar300._0_8_ = uVar54;
  auVar300._10_2_ = uVar100;
  auVar299._10_6_ = auVar300._10_6_;
  auVar299._8_2_ = uVar100;
  auVar299._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar52._4_8_ = auVar299._8_8_;
  auVar52._2_2_ = uVar100;
  auVar52._0_2_ = uVar100;
  auVar149._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar124) * fVar277 + fVar124) - fVar318) *
                fVar102,((((float)(int)(short)uVar56 - (float)(int)(short)uVar55) * fVar277 +
                         (float)(int)(short)uVar55) - fVar313) * fVar143);
  auVar149._8_4_ =
       ((((float)(auVar146._8_4_ >> 0x10) - fVar174) * fVar277 + fVar174) - fVar320) * fVar165;
  auVar149._12_4_ =
       ((((float)(auVar147._12_4_ >> 0x10) - (float)(auVar129._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar129._12_4_ >> 0x10)) - fVar321) * fVar218;
  auVar226._0_4_ =
       ((((float)(int)(short)uVar5 - (float)(int)(short)uVar57) * fVar277 +
        (float)(int)(short)uVar57) - fVar313) * fVar143;
  auVar226._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar125) * fVar277 + fVar125) - fVar318) * fVar102;
  auVar226._8_4_ =
       ((((float)(auVar223._8_4_ >> 0x10) - fVar198) * fVar277 + fVar198) - fVar320) * fVar165;
  auVar226._12_4_ =
       ((((float)(auVar224._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar321) * fVar218;
  auVar257._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar142) * fVar277 + fVar142) - fVar265) *
                fVar103,((((float)(int)(short)uVar7 - (float)(int)(short)uVar6) * fVar277 +
                         (float)(int)(short)uVar6) - fVar253) * fVar72);
  auVar257._8_4_ =
       ((((float)(auVar254._8_4_ >> 0x10) - fVar199) * fVar277 + fVar199) - fVar266) * fVar169;
  auVar257._12_4_ =
       ((((float)(auVar255._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar312) * fVar230;
  auVar272._0_4_ =
       ((((float)(int)(short)uVar8 - (float)(int)(short)uVar63) * fVar277 +
        (float)(int)(short)uVar63) - fVar253) * fVar72;
  auVar272._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar144) * fVar277 + fVar144) - fVar265) * fVar103;
  auVar272._8_4_ =
       ((((float)(auVar269._8_4_ >> 0x10) - fVar202) * fVar277 + fVar202) - fVar266) * fVar169;
  auVar272._12_4_ =
       ((((float)(auVar270._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar312) * fVar230;
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar285._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar160) * fVar277 + fVar160) - fVar251) *
                fVar123,((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar277 +
                         (float)(int)(short)uVar9) - fVar241) * fVar101);
  auVar285._8_4_ =
       ((((float)(auVar282._8_4_ >> 0x10) - fVar213) * fVar277 + fVar213) - fVar252) * fVar171;
  auVar285._12_4_ =
       ((((float)(auVar283._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar268) * fVar234;
  auVar302._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar11) * fVar277 +
        (float)(int)(short)uVar11) - fVar241) * fVar101;
  auVar302._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar162) * fVar277 + fVar162) - fVar251) * fVar123;
  auVar302._8_4_ =
       ((((float)(auVar299._8_4_ >> 0x10) - fVar215) * fVar277 + fVar215) - fVar252) * fVar171;
  auVar302._12_4_ =
       ((((float)(auVar300._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar277 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar268) * fVar234;
  auVar126._8_4_ = auVar149._8_4_;
  auVar126._0_8_ = auVar149._0_8_;
  auVar126._12_4_ = auVar149._12_4_;
  auVar127 = minps(auVar126,auVar226);
  auVar113._8_4_ = auVar257._8_4_;
  auVar113._0_8_ = auVar257._0_8_;
  auVar113._12_4_ = auVar257._12_4_;
  auVar73 = minps(auVar113,auVar272);
  auVar127 = maxps(auVar127,auVar73);
  auVar114._8_4_ = auVar285._8_4_;
  auVar114._0_8_ = auVar285._0_8_;
  auVar114._12_4_ = auVar285._12_4_;
  auVar73 = minps(auVar114,auVar302);
  auVar90._4_4_ = uVar13;
  auVar90._0_4_ = uVar13;
  auVar90._8_4_ = uVar13;
  auVar90._12_4_ = uVar13;
  auVar73 = maxps(auVar73,auVar90);
  auVar73 = maxps(auVar127,auVar73);
  auVar127 = maxps(auVar149,auVar226);
  auVar258 = maxps(auVar257,auVar272);
  auVar127 = minps(auVar127,auVar258);
  local_2d8 = auVar73._0_4_ * 0.99999964;
  fStack_2d4 = auVar73._4_4_ * 0.99999964;
  fStack_2d0 = auVar73._8_4_ * 0.99999964;
  fStack_2cc = auVar73._12_4_ * 0.99999964;
  auVar73 = maxps(auVar285,auVar302);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar91._4_4_ = uVar13;
  auVar91._0_4_ = uVar13;
  auVar91._8_4_ = uVar13;
  auVar91._12_4_ = uVar13;
  auVar73 = minps(auVar73,auVar91);
  auVar73 = minps(auVar127,auVar73);
  uVar66 = (uint)(byte)PVar12;
  auVar115._0_4_ = -(uint)(uVar66 != 0 && local_2d8 <= auVar73._0_4_ * 1.0000004);
  auVar115._4_4_ = -(uint)(1 < uVar66 && fStack_2d4 <= auVar73._4_4_ * 1.0000004);
  auVar115._8_4_ = -(uint)(2 < uVar66 && fStack_2d0 <= auVar73._8_4_ * 1.0000004);
  auVar115._12_4_ = -(uint)(3 < uVar66 && fStack_2cc <= auVar73._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar115);
  if (uVar66 == 0) {
    return;
  }
  uVar66 = uVar66 & 0xff;
  local_278._0_12_ = mm_lookupmask_ps._240_12_;
  local_278._12_4_ = 0;
  local_3e8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3e0 = prim;
LAB_00bf44c4:
  lVar19 = 0;
  if ((ulong)uVar66 != 0) {
    for (; (uVar66 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
    }
  }
  uVar67 = *(uint *)(local_3e0 + 2);
  uVar69 = *(uint *)(local_3e0 + lVar19 * 4 + 6);
  pGVar14 = (context->scene->geometries).items[uVar67].ptr;
  fVar143 = pGVar14->fnumTimeSegments;
  fVar72 = (pGVar14->time_range).lower;
  fVar101 = ((*(float *)(ray + k * 4 + 0x70) - fVar72) / ((pGVar14->time_range).upper - fVar72)) *
            fVar143;
  fVar72 = floorf(fVar101);
  fVar143 = fVar143 + -1.0;
  if (fVar143 <= fVar72) {
    fVar72 = fVar143;
  }
  fVar143 = 0.0;
  if (0.0 <= fVar72) {
    fVar143 = fVar72;
  }
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                           (ulong)uVar69 *
                           pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar64 = (long)(int)fVar143 * 0x38;
  lVar16 = *(long *)(_Var15 + lVar64);
  lVar17 = *(long *)(_Var15 + 0x10 + lVar64);
  pfVar3 = (float *)(lVar16 + lVar17 * uVar55);
  fVar72 = *pfVar3;
  fVar102 = pfVar3[1];
  fVar103 = pfVar3[2];
  fVar123 = pfVar3[3];
  lVar19 = uVar55 + 1;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar19);
  fVar124 = *pfVar3;
  fVar125 = pfVar3[1];
  fVar142 = pfVar3[2];
  fVar144 = pfVar3[3];
  lVar1 = uVar55 + 2;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar1);
  fVar160 = *pfVar3;
  fVar162 = pfVar3[1];
  fVar165 = pfVar3[2];
  fVar169 = pfVar3[3];
  lVar2 = uVar55 + 3;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar2);
  fVar171 = *pfVar3;
  fVar174 = pfVar3[1];
  fVar198 = pfVar3[2];
  fVar199 = pfVar3[3];
  lVar16 = *(long *)&pGVar14[4].fnumTimeSegments;
  lVar17 = *(long *)(lVar16 + lVar64);
  lVar18 = *(long *)(lVar16 + 0x10 + lVar64);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar55);
  fVar202 = *pfVar3;
  fVar213 = pfVar3[1];
  fVar215 = pfVar3[2];
  fVar218 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar230 = *pfVar3;
  fVar234 = pfVar3[1];
  fVar253 = pfVar3[2];
  fVar265 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar266 = *pfVar3;
  fVar312 = pfVar3[1];
  fVar241 = pfVar3[2];
  fVar251 = pfVar3[3];
  fVar101 = fVar101 - fVar143;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar143 = *pfVar3;
  fVar252 = pfVar3[1];
  fVar268 = pfVar3[2];
  fVar277 = pfVar3[3];
  fVar278 = fVar72 * 0.16666667 + fVar124 * 0.6666667 + fVar160 * 0.16666667 + fVar171 * 0.0;
  fVar289 = fVar102 * 0.16666667 + fVar125 * 0.6666667 + fVar162 * 0.16666667 + fVar174 * 0.0;
  fVar293 = fVar103 * 0.16666667 + fVar142 * 0.6666667 + fVar165 * 0.16666667 + fVar198 * 0.0;
  fVar306 = fVar123 * 0.16666667 + fVar144 * 0.6666667 + fVar169 * 0.16666667 + fVar199 * 0.0;
  fVar321 = ((fVar160 * 0.5 + fVar171 * 0.0) - fVar124 * 0.0) - fVar72 * 0.5;
  fVar161 = ((fVar162 * 0.5 + fVar174 * 0.0) - fVar125 * 0.0) - fVar102 * 0.5;
  fVar163 = ((fVar165 * 0.5 + fVar198 * 0.0) - fVar142 * 0.0) - fVar103 * 0.5;
  fVar164 = ((fVar169 * 0.5 + fVar199 * 0.0) - fVar144 * 0.0) - fVar123 * 0.5;
  fVar308 = fVar202 * 0.16666667 + fVar230 * 0.6666667 + fVar266 * 0.16666667 + fVar143 * 0.0;
  fVar307 = fVar213 * 0.16666667 + fVar234 * 0.6666667 + fVar312 * 0.16666667 + fVar252 * 0.0;
  fVar309 = fVar215 * 0.16666667 + fVar253 * 0.6666667 + fVar241 * 0.16666667 + fVar268 * 0.0;
  fVar311 = fVar218 * 0.16666667 + fVar265 * 0.6666667 + fVar251 * 0.16666667 + fVar277 * 0.0;
  fVar279 = ((fVar266 * 0.5 + fVar143 * 0.0) - fVar230 * 0.0) - fVar202 * 0.5;
  fVar291 = ((fVar312 * 0.5 + fVar252 * 0.0) - fVar234 * 0.0) - fVar213 * 0.5;
  fVar296 = ((fVar241 * 0.5 + fVar268 * 0.0) - fVar253 * 0.0) - fVar215 * 0.5;
  fVar294 = ((fVar251 * 0.5 + fVar277 * 0.0) - fVar265 * 0.0) - fVar218 * 0.5;
  fVar166 = fVar124 * 0.16666667 + fVar160 * 0.6666667 + fVar171 * 0.16666667 + fVar72 * 0.0;
  fVar170 = fVar125 * 0.16666667 + fVar162 * 0.6666667 + fVar174 * 0.16666667 + fVar102 * 0.0;
  fVar172 = fVar142 * 0.16666667 + fVar165 * 0.6666667 + fVar198 * 0.16666667 + fVar103 * 0.0;
  fVar173 = fVar144 * 0.16666667 + fVar169 * 0.6666667 + fVar199 * 0.16666667 + fVar123 * 0.0;
  fVar310 = ((fVar160 * 0.0 + fVar171 * 0.5) - fVar124 * 0.5) - fVar72 * 0.0;
  fVar313 = ((fVar162 * 0.0 + fVar174 * 0.5) - fVar125 * 0.5) - fVar102 * 0.0;
  fVar318 = ((fVar165 * 0.0 + fVar198 * 0.5) - fVar142 * 0.5) - fVar103 * 0.0;
  fVar320 = ((fVar169 * 0.0 + fVar199 * 0.5) - fVar144 * 0.5) - fVar123 * 0.0;
  fVar103 = fVar230 * 0.16666667 + fVar266 * 0.6666667 + fVar143 * 0.16666667 + fVar202 * 0.0;
  fVar123 = fVar234 * 0.16666667 + fVar312 * 0.6666667 + fVar252 * 0.16666667 + fVar213 * 0.0;
  fVar124 = fVar253 * 0.16666667 + fVar241 * 0.6666667 + fVar268 * 0.16666667 + fVar215 * 0.0;
  fVar125 = fVar265 * 0.16666667 + fVar251 * 0.6666667 + fVar277 * 0.16666667 + fVar218 * 0.0;
  fVar143 = ((fVar266 * 0.0 + fVar143 * 0.5) - fVar230 * 0.5) - fVar202 * 0.0;
  fVar72 = ((fVar312 * 0.0 + fVar252 * 0.5) - fVar234 * 0.5) - fVar213 * 0.0;
  fVar102 = ((fVar241 * 0.0 + fVar268 * 0.5) - fVar253 * 0.5) - fVar215 * 0.0;
  fVar202 = ((fVar251 * 0.0 + fVar277 * 0.5) - fVar265 * 0.5) - fVar218 * 0.0;
  fVar314 = fVar161 * fVar308 - fVar307 * fVar321;
  fVar319 = fVar163 * fVar307 - fVar309 * fVar161;
  fVar309 = fVar321 * fVar309 - fVar308 * fVar163;
  fVar322 = fVar164 * fVar311 - fVar311 * fVar164;
  fVar218 = fVar161 * fVar279 - fVar291 * fVar321;
  fVar234 = fVar163 * fVar291 - fVar296 * fVar161;
  fVar253 = fVar321 * fVar296 - fVar279 * fVar163;
  fVar241 = fVar313 * fVar103 - fVar123 * fVar310;
  fVar251 = fVar318 * fVar123 - fVar124 * fVar313;
  fVar252 = fVar310 * fVar124 - fVar103 * fVar318;
  fVar268 = fVar320 * fVar125 - fVar125 * fVar320;
  fVar265 = fVar313 * fVar143 - fVar72 * fVar310;
  fVar266 = fVar318 * fVar72 - fVar102 * fVar313;
  fVar312 = fVar310 * fVar102 - fVar143 * fVar318;
  fVar199 = fVar309 * fVar309 + fVar319 * fVar319 + fVar314 * fVar314;
  auVar73 = ZEXT416((uint)fVar199);
  auVar127 = rsqrtss(ZEXT416((uint)fVar199),auVar73);
  fVar143 = auVar127._0_4_;
  fVar277 = fVar143 * 1.5 - fVar143 * fVar143 * fVar199 * 0.5 * fVar143;
  fVar307 = fVar314 * fVar218 + fVar309 * fVar253 + fVar319 * fVar234;
  fVar215 = fVar322 * fVar277;
  auVar73 = rcpss(auVar73,auVar73);
  fVar230 = (2.0 - fVar199 * auVar73._0_4_) * auVar73._0_4_;
  fVar297 = fVar252 * fVar252 + fVar251 * fVar251 + fVar241 * fVar241;
  auVar127 = ZEXT416((uint)fVar297);
  auVar73 = rsqrtss(ZEXT416((uint)fVar297),auVar127);
  fVar143 = auVar73._0_4_;
  fVar311 = fVar143 * 1.5 - fVar143 * fVar143 * fVar297 * 0.5 * fVar143;
  fVar323 = fVar241 * fVar265 + fVar252 * fVar312 + fVar251 * fVar266;
  lVar17 = *(long *)(_Var15 + 0x38 + lVar64);
  lVar18 = *(long *)(_Var15 + 0x48 + lVar64);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar55);
  fVar143 = *pfVar3;
  fVar72 = pfVar3[1];
  fVar102 = pfVar3[2];
  fVar103 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar123 = *pfVar3;
  fVar124 = pfVar3[1];
  fVar125 = pfVar3[2];
  fVar142 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar144 = *pfVar3;
  fVar160 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar165 = pfVar3[3];
  auVar73 = rcpss(auVar127,auVar127);
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar169 = *pfVar3;
  fVar171 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar198 = pfVar3[3];
  lVar17 = *(long *)(lVar16 + 0x38 + lVar64);
  lVar16 = *(long *)(lVar16 + 0x48 + lVar64);
  pRVar61 = (RTCIntersectArguments *)(lVar19 * lVar16);
  fVar213 = fVar268 * fVar311;
  fVar324 = (2.0 - fVar297 * auVar73._0_4_) * auVar73._0_4_;
  fVar279 = fVar306 * fVar319 * fVar277;
  fVar291 = fVar306 * fVar309 * fVar277;
  fVar296 = fVar306 * fVar314 * fVar277;
  fVar308 = fVar306 * fVar215;
  fVar203 = fVar278 - fVar279;
  fVar214 = fVar289 - fVar291;
  fVar216 = fVar293 - fVar296;
  fVar217 = fVar306 - fVar308;
  fVar280 = fVar306 * fVar230 * (fVar199 * fVar234 - fVar307 * fVar319) * fVar277 +
            fVar164 * fVar319 * fVar277;
  fVar290 = fVar306 * fVar230 * (fVar199 * fVar253 - fVar307 * fVar309) * fVar277 +
            fVar164 * fVar309 * fVar277;
  fVar292 = fVar306 * fVar230 * (fVar199 * fVar218 - fVar307 * fVar314) * fVar277 +
            fVar164 * fVar314 * fVar277;
  fVar295 = fVar306 * fVar230 * (fVar199 * (fVar164 * fVar294 - fVar294 * fVar164) -
                                fVar307 * fVar322) * fVar277 + fVar164 * fVar215;
  fVar279 = fVar279 + fVar278;
  fVar291 = fVar291 + fVar289;
  fVar296 = fVar296 + fVar293;
  fVar308 = fVar308 + fVar306;
  fVar278 = fVar173 * fVar251 * fVar311;
  fVar289 = fVar173 * fVar252 * fVar311;
  fVar293 = fVar173 * fVar241 * fVar311;
  fVar306 = fVar173 * fVar213;
  fVar219 = fVar166 - fVar278;
  fVar231 = fVar170 - fVar289;
  fVar235 = fVar172 - fVar293;
  fVar238 = fVar173 - fVar306;
  fVar294 = fVar173 * fVar324 * (fVar297 * fVar266 - fVar323 * fVar251) * fVar311 +
            fVar320 * fVar251 * fVar311;
  fVar307 = fVar173 * fVar324 * (fVar297 * fVar312 - fVar323 * fVar252) * fVar311 +
            fVar320 * fVar252 * fVar311;
  fVar309 = fVar173 * fVar324 * (fVar297 * fVar265 - fVar323 * fVar241) * fVar311 +
            fVar320 * fVar241 * fVar311;
  fVar311 = fVar173 * fVar324 * (fVar297 * (fVar320 * fVar202 - fVar202 * fVar320) -
                                fVar323 * fVar268) * fVar311 + fVar320 * fVar213;
  fVar278 = fVar278 + fVar166;
  fVar289 = fVar289 + fVar170;
  fVar293 = fVar293 + fVar172;
  fVar306 = fVar306 + fVar173;
  fVar220 = fVar143 * 0.16666667 + fVar123 * 0.6666667 + fVar144 * 0.16666667 + fVar169 * 0.0;
  fVar232 = fVar72 * 0.16666667 + fVar124 * 0.6666667 + fVar160 * 0.16666667 + fVar171 * 0.0;
  fVar236 = fVar102 * 0.16666667 + fVar125 * 0.6666667 + fVar162 * 0.16666667 + fVar174 * 0.0;
  fVar239 = fVar103 * 0.16666667 + fVar142 * 0.6666667 + fVar165 * 0.16666667 + fVar198 * 0.0;
  fVar166 = ((fVar144 * 0.5 + fVar169 * 0.0) - fVar123 * 0.0) - fVar143 * 0.5;
  fVar170 = ((fVar160 * 0.5 + fVar171 * 0.0) - fVar124 * 0.0) - fVar72 * 0.5;
  fVar172 = ((fVar162 * 0.5 + fVar174 * 0.0) - fVar125 * 0.0) - fVar102 * 0.5;
  fVar173 = ((fVar165 * 0.5 + fVar198 * 0.0) - fVar142 * 0.0) - fVar103 * 0.5;
  pfVar3 = (float *)(lVar17 + lVar16 * lVar2);
  fVar199 = *pfVar3;
  fVar202 = pfVar3[1];
  fVar213 = pfVar3[2];
  fVar215 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar1 * lVar16);
  fVar218 = *pfVar3;
  fVar230 = pfVar3[1];
  fVar234 = pfVar3[2];
  fVar253 = pfVar3[3];
  pfVar3 = (float *)((long)&pRVar61->flags + lVar17);
  fVar265 = *pfVar3;
  fVar266 = pfVar3[1];
  fVar312 = pfVar3[2];
  fVar241 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + uVar55 * lVar16);
  fVar251 = *pfVar3;
  fVar252 = pfVar3[1];
  fVar268 = pfVar3[2];
  fVar277 = pfVar3[3];
  fVar221 = fVar251 * 0.16666667 + fVar265 * 0.6666667 + fVar218 * 0.16666667 + fVar199 * 0.0;
  fVar233 = fVar252 * 0.16666667 + fVar266 * 0.6666667 + fVar230 * 0.16666667 + fVar202 * 0.0;
  fVar237 = fVar268 * 0.16666667 + fVar312 * 0.6666667 + fVar234 * 0.16666667 + fVar213 * 0.0;
  fVar240 = fVar277 * 0.16666667 + fVar241 * 0.6666667 + fVar253 * 0.16666667 + fVar215 * 0.0;
  fVar323 = ((fVar218 * 0.5 + fVar199 * 0.0) - fVar265 * 0.0) - fVar251 * 0.5;
  fVar324 = ((fVar230 * 0.5 + fVar202 * 0.0) - fVar266 * 0.0) - fVar252 * 0.5;
  fVar200 = ((fVar234 * 0.5 + fVar213 * 0.0) - fVar312 * 0.0) - fVar268 * 0.5;
  fVar201 = ((fVar253 * 0.5 + fVar215 * 0.0) - fVar241 * 0.0) - fVar277 * 0.5;
  fVar297 = fVar123 * 0.16666667 + fVar144 * 0.6666667 + fVar169 * 0.16666667 + fVar143 * 0.0;
  fVar314 = fVar124 * 0.16666667 + fVar160 * 0.6666667 + fVar171 * 0.16666667 + fVar72 * 0.0;
  fVar319 = fVar125 * 0.16666667 + fVar162 * 0.6666667 + fVar174 * 0.16666667 + fVar102 * 0.0;
  fVar322 = fVar142 * 0.16666667 + fVar165 * 0.6666667 + fVar198 * 0.16666667 + fVar103 * 0.0;
  fVar123 = ((fVar144 * 0.0 + fVar169 * 0.5) - fVar123 * 0.5) - fVar143 * 0.0;
  fVar144 = ((fVar160 * 0.0 + fVar171 * 0.5) - fVar124 * 0.5) - fVar72 * 0.0;
  fVar162 = ((fVar162 * 0.0 + fVar174 * 0.5) - fVar125 * 0.5) - fVar102 * 0.0;
  fVar169 = ((fVar165 * 0.0 + fVar198 * 0.5) - fVar142 * 0.5) - fVar103 * 0.0;
  fVar124 = fVar265 * 0.16666667 + fVar218 * 0.6666667 + fVar199 * 0.16666667 + fVar251 * 0.0;
  fVar125 = fVar266 * 0.16666667 + fVar230 * 0.6666667 + fVar202 * 0.16666667 + fVar252 * 0.0;
  fVar142 = fVar312 * 0.16666667 + fVar234 * 0.6666667 + fVar213 * 0.16666667 + fVar268 * 0.0;
  fVar267 = fVar241 * 0.16666667 + fVar253 * 0.6666667 + fVar215 * 0.16666667 + fVar277 * 0.0;
  fVar143 = ((fVar218 * 0.0 + fVar199 * 0.5) - fVar265 * 0.5) - fVar251 * 0.0;
  fVar72 = ((fVar230 * 0.0 + fVar202 * 0.5) - fVar266 * 0.5) - fVar252 * 0.0;
  fVar102 = ((fVar234 * 0.0 + fVar213 * 0.5) - fVar312 * 0.5) - fVar268 * 0.0;
  fVar160 = ((fVar253 * 0.0 + fVar215 * 0.5) - fVar241 * 0.5) - fVar277 * 0.0;
  fVar215 = fVar170 * fVar221 - fVar233 * fVar166;
  fVar202 = fVar172 * fVar233 - fVar237 * fVar170;
  fVar213 = fVar166 * fVar237 - fVar221 * fVar172;
  fVar218 = fVar173 * fVar240 - fVar240 * fVar173;
  fVar103 = fVar170 * fVar323 - fVar324 * fVar166;
  fVar171 = fVar172 * fVar324 - fVar200 * fVar170;
  fVar198 = fVar166 * fVar200 - fVar323 * fVar172;
  fVar165 = fVar144 * fVar124 - fVar125 * fVar123;
  fVar174 = fVar162 * fVar125 - fVar142 * fVar144;
  fVar199 = fVar123 * fVar142 - fVar124 * fVar162;
  fVar312 = fVar169 * fVar267 - fVar267 * fVar169;
  fVar124 = fVar144 * fVar143 - fVar72 * fVar123;
  fVar125 = fVar162 * fVar72 - fVar102 * fVar144;
  fVar142 = fVar123 * fVar102 - fVar143 * fVar162;
  fVar143 = fVar213 * fVar213 + fVar202 * fVar202 + fVar215 * fVar215;
  auVar73 = ZEXT416((uint)fVar143);
  auVar127 = rsqrtss(ZEXT416((uint)fVar143),auVar73);
  fVar72 = auVar127._0_4_;
  fVar266 = fVar72 * 1.5 - fVar72 * fVar72 * fVar143 * 0.5 * fVar72;
  fVar241 = fVar215 * fVar103 + fVar213 * fVar198 + fVar202 * fVar171;
  auVar73 = rcpss(auVar73,auVar73);
  fVar72 = (2.0 - fVar143 * auVar73._0_4_) * auVar73._0_4_;
  fVar102 = fVar218 * fVar266;
  fVar251 = fVar199 * fVar199 + fVar174 * fVar174 + fVar165 * fVar165;
  auVar73 = ZEXT416((uint)fVar251);
  auVar127 = rsqrtss(ZEXT416((uint)fVar251),auVar73);
  fVar230 = auVar127._0_4_;
  fVar268 = fVar230 * 1.5 - fVar230 * fVar230 * fVar251 * 0.5 * fVar230;
  fVar200 = fVar165 * fVar124 + fVar199 * fVar142 + fVar174 * fVar125;
  auVar73 = rcpss(auVar73,auVar73);
  fVar221 = (2.0 - fVar251 * auVar73._0_4_) * auVar73._0_4_;
  fVar252 = fVar312 * fVar268;
  fVar230 = fVar239 * fVar202 * fVar266;
  fVar234 = fVar239 * fVar213 * fVar266;
  fVar253 = fVar239 * fVar215 * fVar266;
  fVar265 = fVar239 * fVar102;
  fVar202 = fVar239 * fVar72 * (fVar143 * fVar171 - fVar241 * fVar202) * fVar266 +
            fVar173 * fVar202 * fVar266;
  fVar213 = fVar239 * fVar72 * (fVar143 * fVar198 - fVar241 * fVar213) * fVar266 +
            fVar173 * fVar213 * fVar266;
  fVar215 = fVar239 * fVar72 * (fVar143 * fVar103 - fVar241 * fVar215) * fVar266 +
            fVar173 * fVar215 * fVar266;
  fVar218 = fVar239 * fVar72 * (fVar143 * (fVar173 * fVar201 - fVar201 * fVar173) -
                               fVar241 * fVar218) * fVar266 + fVar173 * fVar102;
  fVar171 = fVar220 - fVar230;
  fVar198 = fVar232 - fVar234;
  fVar266 = fVar236 - fVar253;
  fVar241 = fVar239 - fVar265;
  fVar230 = fVar230 + fVar220;
  fVar234 = fVar234 + fVar232;
  fVar253 = fVar253 + fVar236;
  fVar265 = fVar265 + fVar239;
  fVar143 = fVar322 * fVar174 * fVar268;
  fVar72 = fVar322 * fVar199 * fVar268;
  fVar102 = fVar322 * fVar165 * fVar268;
  fVar103 = fVar322 * fVar252;
  fVar277 = fVar322 * fVar221 * (fVar251 * fVar125 - fVar200 * fVar174) * fVar268 +
            fVar169 * fVar174 * fVar268;
  fVar323 = fVar322 * fVar221 * (fVar251 * fVar142 - fVar200 * fVar199) * fVar268 +
            fVar169 * fVar199 * fVar268;
  fVar324 = fVar322 * fVar221 * (fVar251 * fVar124 - fVar200 * fVar165) * fVar268 +
            fVar169 * fVar165 * fVar268;
  fVar200 = fVar322 * fVar221 * (fVar251 * (fVar169 * fVar160 - fVar160 * fVar169) -
                                fVar200 * fVar312) * fVar268 + fVar169 * fVar252;
  fVar124 = fVar297 - fVar143;
  fVar125 = fVar314 - fVar72;
  fVar142 = fVar319 - fVar102;
  fVar160 = fVar322 - fVar103;
  fVar143 = fVar143 + fVar297;
  fVar72 = fVar72 + fVar314;
  fVar102 = fVar102 + fVar319;
  fVar103 = fVar103 + fVar322;
  fVar297 = 1.0 - fVar101;
  fVar314 = fVar203 * fVar297 + fVar171 * fVar101;
  fVar319 = fVar214 * fVar297 + fVar198 * fVar101;
  fVar322 = fVar216 * fVar297 + fVar266 * fVar101;
  fVar201 = fVar217 * fVar297 + fVar241 * fVar101;
  fVar203 = ((fVar321 - fVar280) * 0.33333334 + fVar203) * fVar297 +
            ((fVar166 - fVar202) * 0.33333334 + fVar171) * fVar101;
  fVar214 = ((fVar161 - fVar290) * 0.33333334 + fVar214) * fVar297 +
            ((fVar170 - fVar213) * 0.33333334 + fVar198) * fVar101;
  fVar216 = ((fVar163 - fVar292) * 0.33333334 + fVar216) * fVar297 +
            ((fVar172 - fVar215) * 0.33333334 + fVar266) * fVar101;
  fVar217 = ((fVar164 - fVar295) * 0.33333334 + fVar217) * fVar297 +
            ((fVar173 - fVar218) * 0.33333334 + fVar241) * fVar101;
  fVar266 = (fVar219 - (fVar310 - fVar294) * 0.33333334) * fVar297 +
            (fVar124 - (fVar123 - fVar277) * 0.33333334) * fVar101;
  fVar312 = (fVar231 - (fVar313 - fVar307) * 0.33333334) * fVar297 +
            (fVar125 - (fVar144 - fVar323) * 0.33333334) * fVar101;
  fVar241 = (fVar235 - (fVar318 - fVar309) * 0.33333334) * fVar297 +
            (fVar142 - (fVar162 - fVar324) * 0.33333334) * fVar101;
  fVar251 = (fVar238 - (fVar320 - fVar311) * 0.33333334) * fVar297 +
            (fVar160 - (fVar169 - fVar200) * 0.33333334) * fVar101;
  fVar171 = fVar219 * fVar297 + fVar124 * fVar101;
  fVar174 = fVar231 * fVar297 + fVar125 * fVar101;
  fVar198 = fVar235 * fVar297 + fVar142 * fVar101;
  fVar199 = fVar238 * fVar297 + fVar160 * fVar101;
  fVar124 = fVar279 * fVar297 + fVar230 * fVar101;
  fVar142 = fVar291 * fVar297 + fVar234 * fVar101;
  fVar160 = fVar296 * fVar297 + fVar253 * fVar101;
  fVar165 = fVar308 * fVar297 + fVar265 * fVar101;
  fVar252 = ((fVar280 + fVar321) * 0.33333334 + fVar279) * fVar297 +
            ((fVar202 + fVar166) * 0.33333334 + fVar230) * fVar101;
  fVar268 = ((fVar290 + fVar161) * 0.33333334 + fVar291) * fVar297 +
            ((fVar213 + fVar170) * 0.33333334 + fVar234) * fVar101;
  fVar253 = ((fVar292 + fVar163) * 0.33333334 + fVar296) * fVar297 +
            ((fVar215 + fVar172) * 0.33333334 + fVar253) * fVar101;
  fVar265 = ((fVar295 + fVar164) * 0.33333334 + fVar308) * fVar297 +
            ((fVar218 + fVar173) * 0.33333334 + fVar265) * fVar101;
  fVar125 = (fVar278 - (fVar294 + fVar310) * 0.33333334) * fVar297 +
            (fVar143 - (fVar277 + fVar123) * 0.33333334) * fVar101;
  fVar144 = (fVar289 - (fVar307 + fVar313) * 0.33333334) * fVar297 +
            (fVar72 - (fVar323 + fVar144) * 0.33333334) * fVar101;
  fVar162 = (fVar293 - (fVar309 + fVar318) * 0.33333334) * fVar297 +
            (fVar102 - (fVar324 + fVar162) * 0.33333334) * fVar101;
  fVar169 = (fVar306 - (fVar311 + fVar320) * 0.33333334) * fVar297 +
            (fVar103 - (fVar200 + fVar169) * 0.33333334) * fVar101;
  local_288 = fVar297 * fVar278 + fVar101 * fVar143;
  fStack_284 = fVar297 * fVar289 + fVar101 * fVar72;
  fStack_280 = fVar297 * fVar293 + fVar101 * fVar102;
  fStack_27c = fVar297 * fVar306 + fVar101 * fVar103;
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  local_158 = fVar314 - local_1c8;
  fStack_154 = fVar319 - fStack_1c4;
  fStack_150 = fVar322 - fStack_1c0;
  fStack_14c = fVar201 - 0.0;
  fVar143 = pre->ray_space[k].vx.field_0.m128[0];
  fVar72 = pre->ray_space[k].vx.field_0.m128[1];
  fVar101 = pre->ray_space[k].vy.field_0.m128[0];
  fVar102 = pre->ray_space[k].vy.field_0.m128[1];
  fVar103 = pre->ray_space[k].vz.field_0.m128[0];
  fVar123 = pre->ray_space[k].vz.field_0.m128[1];
  fVar202 = local_158 * fVar143 + fStack_154 * fVar101 + fStack_150 * fVar103;
  fVar215 = local_158 * fVar72 + fStack_154 * fVar102 + fStack_150 * fVar123;
  local_168 = fVar203 - local_1c8;
  fStack_164 = fVar214 - fStack_1c4;
  fStack_160 = fVar216 - fStack_1c0;
  fStack_15c = fVar217 - 0.0;
  fVar296 = local_168 * fVar143 + fStack_164 * fVar101 + fStack_160 * fVar103;
  fVar306 = local_168 * fVar72 + fStack_164 * fVar102 + fStack_160 * fVar123;
  local_318 = CONCAT44(fVar306,fVar296);
  local_178 = fVar266 - local_1c8;
  fStack_174 = fVar312 - fStack_1c4;
  fStack_170 = fVar241 - fStack_1c0;
  fStack_16c = fVar251 - 0.0;
  fVar230 = local_178 * fVar143 + fStack_174 * fVar101 + fStack_170 * fVar103;
  fVar234 = local_178 * fVar72 + fStack_174 * fVar102 + fStack_170 * fVar123;
  local_328 = CONCAT44(fVar234,fVar230);
  local_188 = fVar171 - local_1c8;
  fStack_184 = fVar174 - fStack_1c4;
  fStack_180 = fVar198 - fStack_1c0;
  fStack_17c = fVar199 - 0.0;
  fVar213 = local_188 * fVar143 + fStack_184 * fVar101 + fStack_180 * fVar103;
  fVar218 = local_188 * fVar72 + fStack_184 * fVar102 + fStack_180 * fVar123;
  local_338 = CONCAT44(fVar218,fVar213);
  local_198 = fVar124 - local_1c8;
  fStack_194 = fVar142 - fStack_1c4;
  fStack_190 = fVar160 - fStack_1c0;
  fStack_18c = fVar165 - 0.0;
  fVar277 = local_198 * fVar143 + fStack_194 * fVar101 + fStack_190 * fVar103;
  fVar278 = local_198 * fVar72 + fStack_194 * fVar102 + fStack_190 * fVar123;
  local_348 = CONCAT44(fVar278,fVar277);
  local_1a8 = fVar252 - local_1c8;
  fStack_1a4 = fVar268 - fStack_1c4;
  fStack_1a0 = fVar253 - fStack_1c0;
  fStack_19c = fVar265 - 0.0;
  fVar279 = local_1a8 * fVar143 + fStack_1a4 * fVar101 + fStack_1a0 * fVar103;
  fVar289 = local_1a8 * fVar72 + fStack_1a4 * fVar102 + fStack_1a0 * fVar123;
  local_358 = CONCAT44(fVar289,fVar279);
  local_1b8 = fVar125 - local_1c8;
  fStack_1b4 = fVar144 - fStack_1c4;
  fStack_1b0 = fVar162 - fStack_1c0;
  fStack_1ac = fVar169 - 0.0;
  fVar291 = local_1b8 * fVar143 + fStack_1b4 * fVar101 + fStack_1b0 * fVar103;
  fVar293 = local_1b8 * fVar72 + fStack_1b4 * fVar102 + fStack_1b0 * fVar123;
  local_368 = CONCAT44(fVar293,fVar291);
  local_1c8 = local_288 - local_1c8;
  fStack_1c4 = fStack_284 - fStack_1c4;
  fStack_1c0 = fStack_280 - fStack_1c0;
  fStack_1bc = fStack_27c - 0.0;
  fVar101 = local_1c8 * fVar143 + fStack_1c4 * fVar101 + fStack_1c0 * fVar103;
  fVar72 = local_1c8 * fVar72 + fStack_1c4 * fVar102 + fStack_1c0 * fVar123;
  local_378 = CONCAT44(fVar72,fVar101);
  auVar191._8_8_ = local_358;
  auVar191._0_8_ = local_318;
  register0x00001488 = local_378;
  local_148 = local_338;
  auVar92._8_4_ = fVar277;
  auVar92._0_8_ = CONCAT44(fVar215,fVar202);
  auVar92._12_4_ = fVar278;
  auVar73 = minps(auVar92,auVar191);
  auVar116._8_4_ = fVar291;
  auVar116._0_8_ = local_328;
  auVar116._12_4_ = fVar293;
  auVar127 = minps(auVar116,_local_148);
  auVar73 = minps(auVar73,auVar127);
  auVar117._8_4_ = fVar277;
  auVar117._0_8_ = CONCAT44(fVar215,fVar202);
  auVar117._12_4_ = fVar278;
  auVar127 = maxps(auVar117,auVar191);
  auVar128._4_4_ = fVar234;
  auVar128._0_4_ = fVar230;
  auVar128._8_4_ = fVar291;
  auVar128._12_4_ = fVar293;
  auVar129 = maxps(auVar128,_local_148);
  auVar258 = maxps(auVar127,auVar129);
  auVar20._4_8_ = auVar129._8_8_;
  auVar20._0_4_ = auVar73._4_4_;
  auVar130._0_8_ = auVar20._0_8_ << 0x20;
  auVar130._8_4_ = auVar73._8_4_;
  auVar130._12_4_ = auVar73._12_4_;
  auVar131._8_8_ = auVar73._8_8_;
  auVar131._0_8_ = auVar130._8_8_;
  auVar127 = minps(auVar73,auVar131);
  auVar21._4_8_ = auVar73._8_8_;
  auVar21._0_4_ = auVar258._4_4_;
  auVar132._0_8_ = auVar21._0_8_ << 0x20;
  auVar132._8_4_ = auVar258._8_4_;
  auVar132._12_4_ = auVar258._12_4_;
  auVar133._8_8_ = auVar258._8_8_;
  auVar133._0_8_ = auVar132._8_8_;
  auVar73 = maxps(auVar258,auVar133);
  auVar93._0_8_ = auVar127._0_8_ & 0x7fffffff7fffffff;
  auVar93._8_4_ = auVar127._8_4_ & 0x7fffffff;
  auVar93._12_4_ = auVar127._12_4_ & 0x7fffffff;
  auVar118._0_8_ = auVar73._0_8_ & 0x7fffffff7fffffff;
  auVar118._8_4_ = auVar73._8_4_ & 0x7fffffff;
  auVar118._12_4_ = auVar73._12_4_ & 0x7fffffff;
  auVar73 = maxps(auVar93,auVar118);
  fVar143 = auVar73._4_4_;
  if (auVar73._4_4_ <= auVar73._0_4_) {
    fVar143 = auVar73._0_4_;
  }
  local_3d0 = (ulong)uVar66 + 0xf;
  fVar143 = fVar143 * 9.536743e-07;
  local_258 = fVar143;
  fStack_254 = fVar143;
  fStack_250 = fVar143;
  fStack_24c = fVar143;
  local_268 = -fVar143;
  fStack_264 = -fVar143;
  fStack_260 = -fVar143;
  fStack_25c = -fVar143;
  local_118 = fVar296 - fVar202;
  fStack_114 = fVar306 - fVar215;
  fStack_110 = fVar279 - fVar277;
  fStack_10c = fVar289 - fVar278;
  local_128 = fVar230 - fVar296;
  fStack_124 = fVar234 - fVar306;
  fStack_120 = fVar291 - fVar279;
  fStack_11c = fVar293 - fVar289;
  local_138 = fVar213 - fVar230;
  fStack_134 = fVar218 - fVar234;
  fStack_130 = fVar101 - fVar291;
  fStack_12c = fVar72 - fVar293;
  local_298 = fVar124 - fVar314;
  fStack_294 = fVar142 - fVar319;
  fStack_290 = fVar160 - fVar322;
  fStack_28c = fVar165 - fVar201;
  local_2a8 = fVar252 - fVar203;
  fStack_2a4 = fVar268 - fVar214;
  fStack_2a0 = fVar253 - fVar216;
  fStack_29c = fVar265 - fVar217;
  local_2b8 = fVar125 - fVar266;
  fStack_2b4 = fVar144 - fVar312;
  fStack_2b0 = fVar162 - fVar241;
  fStack_2ac = fVar169 - fVar251;
  local_2c8 = local_288 - fVar171;
  fStack_2c4 = fStack_284 - fVar174;
  fStack_2c0 = fStack_280 - fVar198;
  fStack_2bc = fStack_27c - fVar199;
  local_2e8 = uVar67;
  uStack_2e4 = uVar67;
  uStack_2e0 = uVar67;
  uStack_2dc = uVar67;
  local_2f8 = uVar69;
  uStack_2f4 = uVar69;
  uStack_2f0 = uVar69;
  uStack_2ec = uVar69;
  uVar55 = 0;
  fVar72 = *(float *)(ray + k * 4 + 0x30);
  local_548 = 0x3f80000000000000;
  local_518 = 0x3f80000000000000;
  local_3d8 = (ulong)uVar69;
  uStack_370 = local_378;
  uStack_360 = local_368;
  uStack_350 = local_358;
  uStack_340 = local_348;
  uStack_330 = local_338;
  uStack_320 = local_328;
  uStack_310 = local_318;
  do {
    fVar101 = 1.0 - (float)local_548;
    fVar102 = 1.0 - (float)local_548;
    fVar103 = 1.0 - local_548._4_4_;
    fVar123 = 1.0 - local_548._4_4_;
    fVar144 = fVar202 * fVar101 + (float)local_348 * (float)local_548;
    fVar165 = fVar215 * fVar102 + local_348._4_4_ * (float)local_548;
    fVar313 = fVar202 * fVar103 + (float)uStack_340 * local_548._4_4_;
    fVar320 = fVar215 * fVar123 + uStack_340._4_4_ * local_548._4_4_;
    fVar218 = (float)local_318 * fVar101 + (float)local_358 * (float)local_548;
    fVar308 = local_318._4_4_ * fVar102 + local_358._4_4_ * (float)local_548;
    fVar166 = (float)uStack_310 * fVar103 + (float)uStack_350 * local_548._4_4_;
    fVar172 = uStack_310._4_4_ * fVar123 + uStack_350._4_4_ * local_548._4_4_;
    fVar161 = (float)local_328 * fVar101 + (float)local_368 * (float)local_548;
    fVar307 = local_328._4_4_ * fVar102 + local_368._4_4_ * (float)local_548;
    fVar164 = (float)uStack_320 * fVar103 + (float)uStack_360 * local_548._4_4_;
    fVar297 = uStack_320._4_4_ * fVar123 + uStack_360._4_4_ * local_548._4_4_;
    fVar170 = fVar101 * (float)local_338 + (float)local_548 * (float)local_378;
    fVar163 = fVar102 * local_338._4_4_ + (float)local_548 * local_378._4_4_;
    fVar231 = fVar103 * (float)uStack_330 + local_548._4_4_ * (float)uStack_370;
    fVar232 = fVar123 * uStack_330._4_4_ + local_548._4_4_ * uStack_370._4_4_;
    fVar101 = (local_518._4_4_ - (float)local_518) * 0.11111111;
    fVar323 = (local_518._4_4_ - (float)local_518) * 0.0 + (float)local_518;
    fVar324 = (local_518._4_4_ - (float)local_518) * 0.33333334 + (float)local_518;
    fVar200 = (local_518._4_4_ - (float)local_518) * 0.6666667 + (float)local_518;
    fVar201 = (local_518._4_4_ - (float)local_518) * 1.0 + (float)local_518;
    fVar217 = 1.0 - fVar323;
    fVar219 = 1.0 - fVar324;
    fVar220 = 1.0 - fVar200;
    fVar221 = 1.0 - fVar201;
    fVar125 = fVar218 * fVar217 + fVar161 * fVar323;
    fVar169 = fVar218 * fVar219 + fVar161 * fVar324;
    fVar199 = fVar218 * fVar220 + fVar161 * fVar200;
    fVar213 = fVar218 * fVar221 + fVar161 * fVar201;
    fVar310 = fVar308 * fVar217 + fVar307 * fVar323;
    fVar318 = fVar308 * fVar219 + fVar307 * fVar324;
    fVar321 = fVar308 * fVar220 + fVar307 * fVar200;
    fVar294 = fVar308 * fVar221 + fVar307 * fVar201;
    fVar102 = (fVar144 * fVar217 + fVar218 * fVar323) * fVar217 + fVar323 * fVar125;
    fVar103 = (fVar144 * fVar219 + fVar218 * fVar324) * fVar219 + fVar324 * fVar169;
    fVar123 = (fVar144 * fVar220 + fVar218 * fVar200) * fVar220 + fVar200 * fVar199;
    fVar144 = (fVar144 * fVar221 + fVar218 * fVar201) * fVar221 + fVar201 * fVar213;
    fVar218 = (fVar165 * fVar217 + fVar308 * fVar323) * fVar217 + fVar323 * fVar310;
    fVar265 = (fVar165 * fVar219 + fVar308 * fVar324) * fVar219 + fVar324 * fVar318;
    fVar251 = (fVar165 * fVar220 + fVar308 * fVar200) * fVar220 + fVar200 * fVar321;
    fVar308 = (fVar165 * fVar221 + fVar308 * fVar201) * fVar221 + fVar201 * fVar294;
    fVar165 = fVar125 * fVar217 + (fVar161 * fVar217 + fVar170 * fVar323) * fVar323;
    fVar125 = fVar169 * fVar219 + (fVar161 * fVar219 + fVar170 * fVar324) * fVar324;
    fVar169 = fVar199 * fVar220 + (fVar161 * fVar220 + fVar170 * fVar200) * fVar200;
    fVar199 = fVar213 * fVar221 + (fVar161 * fVar221 + fVar170 * fVar201) * fVar201;
    fVar213 = fVar310 * fVar217 + (fVar307 * fVar217 + fVar163 * fVar323) * fVar323;
    fVar310 = fVar318 * fVar219 + (fVar307 * fVar219 + fVar163 * fVar324) * fVar324;
    fVar318 = fVar321 * fVar220 + (fVar307 * fVar220 + fVar163 * fVar200) * fVar200;
    fVar321 = fVar294 * fVar221 + (fVar307 * fVar221 + fVar163 * fVar201) * fVar201;
    local_398 = fVar217 * fVar102 + fVar323 * fVar165;
    fStack_394 = fVar219 * fVar103 + fVar324 * fVar125;
    fStack_390 = fVar220 * fVar123 + fVar200 * fVar169;
    fStack_38c = fVar221 * fVar144 + fVar201 * fVar199;
    local_388 = fVar217 * fVar218 + fVar323 * fVar213;
    fStack_384 = fVar219 * fVar265 + fVar324 * fVar310;
    fStack_380 = fVar220 * fVar251 + fVar200 * fVar318;
    fStack_37c = fVar221 * fVar308 + fVar201 * fVar321;
    fVar103 = (fVar125 - fVar103) * 3.0 * fVar101;
    fVar125 = (fVar169 - fVar123) * 3.0 * fVar101;
    fVar144 = (fVar199 - fVar144) * 3.0 * fVar101;
    fVar169 = (fVar310 - fVar265) * 3.0 * fVar101;
    fVar199 = (fVar318 - fVar251) * 3.0 * fVar101;
    fVar308 = (fVar321 - fVar308) * 3.0 * fVar101;
    local_1f8._4_4_ = fStack_390;
    local_1f8._0_4_ = fStack_394;
    local_1d8._4_4_ = fStack_380;
    local_1d8._0_4_ = fStack_384;
    fVar265 = local_398 + (fVar165 - fVar102) * 3.0 * fVar101;
    fVar251 = fStack_394 + fVar103;
    fVar310 = fStack_390 + fVar125;
    fVar318 = fStack_38c + fVar144;
    fVar102 = local_388 + (fVar213 - fVar218) * 3.0 * fVar101;
    fVar123 = fStack_384 + fVar169;
    fStack_530 = fStack_380 + fVar199;
    fStack_52c = fStack_37c + fVar308;
    fVar103 = fStack_394 - fVar103;
    fVar125 = fStack_390 - fVar125;
    fVar144 = fStack_38c - fVar144;
    local_1d8._8_4_ = fStack_37c;
    local_1d8._12_4_ = 0;
    local_1e8._0_4_ = fStack_384 - fVar169;
    local_1e8._4_4_ = fStack_380 - fVar199;
    local_1e8._8_4_ = fStack_37c - fVar308;
    local_1e8._12_4_ = 0;
    fVar165 = fVar166 * fVar217 + fVar164 * fVar323;
    fVar169 = fVar166 * fVar219 + fVar164 * fVar324;
    fVar199 = fVar166 * fVar220 + fVar164 * fVar200;
    fVar213 = fVar166 * fVar221 + fVar164 * fVar201;
    fVar218 = fVar172 * fVar217 + fVar297 * fVar323;
    fVar308 = fVar172 * fVar219 + fVar297 * fVar324;
    fVar311 = fVar172 * fVar220 + fVar297 * fVar200;
    fVar173 = fVar172 * fVar221 + fVar297 * fVar201;
    fVar307 = (fVar313 * fVar217 + fVar166 * fVar323) * fVar217 + fVar323 * fVar165;
    fVar170 = (fVar313 * fVar219 + fVar166 * fVar324) * fVar219 + fVar324 * fVar169;
    fVar163 = (fVar313 * fVar220 + fVar166 * fVar200) * fVar220 + fVar200 * fVar199;
    fVar309 = (fVar313 * fVar221 + fVar166 * fVar201) * fVar221 + fVar201 * fVar213;
    fVar161 = (fVar320 * fVar217 + fVar172 * fVar323) * fVar217 + fVar323 * fVar218;
    fVar321 = (fVar320 * fVar219 + fVar172 * fVar324) * fVar219 + fVar324 * fVar308;
    fVar294 = (fVar320 * fVar220 + fVar172 * fVar200) * fVar220 + fVar200 * fVar311;
    fVar166 = (fVar320 * fVar221 + fVar172 * fVar201) * fVar221 + fVar201 * fVar173;
    fVar165 = fVar165 * fVar217 + (fVar164 * fVar217 + fVar231 * fVar323) * fVar323;
    fVar169 = fVar169 * fVar219 + (fVar164 * fVar219 + fVar231 * fVar324) * fVar324;
    fVar199 = fVar199 * fVar220 + (fVar164 * fVar220 + fVar231 * fVar200) * fVar200;
    fVar213 = fVar213 * fVar221 + (fVar164 * fVar221 + fVar231 * fVar201) * fVar201;
    fVar172 = fVar218 * fVar217 + (fVar297 * fVar217 + fVar232 * fVar323) * fVar323;
    fVar164 = fVar308 * fVar219 + (fVar297 * fVar219 + fVar232 * fVar324) * fVar324;
    fVar311 = fVar311 * fVar220 + (fVar297 * fVar220 + fVar232 * fVar200) * fVar200;
    fVar173 = fVar173 * fVar221 + (fVar297 * fVar221 + fVar232 * fVar201) * fVar201;
    fVar218 = fVar217 * fVar307 + fVar323 * fVar165;
    fVar308 = fVar219 * fVar170 + fVar324 * fVar169;
    fVar313 = fVar220 * fVar163 + fVar200 * fVar199;
    fVar320 = fVar221 * fVar309 + fVar201 * fVar213;
    fVar297 = fVar217 * fVar161 + fVar323 * fVar172;
    fVar323 = fVar219 * fVar321 + fVar324 * fVar164;
    fVar324 = fVar220 * fVar294 + fVar200 * fVar311;
    fVar200 = fVar221 * fVar166 + fVar201 * fVar173;
    fVar169 = (fVar169 - fVar170) * 3.0 * fVar101;
    fVar199 = (fVar199 - fVar163) * 3.0 * fVar101;
    fVar213 = (fVar213 - fVar309) * 3.0 * fVar101;
    fVar170 = (fVar164 - fVar321) * 3.0 * fVar101;
    fVar163 = (fVar311 - fVar294) * 3.0 * fVar101;
    fVar309 = (fVar173 - fVar166) * 3.0 * fVar101;
    local_208._4_4_ = fVar313;
    local_208._0_4_ = fVar308;
    local_208._8_4_ = fVar320;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar324;
    local_228._0_4_ = fVar323;
    local_228._8_4_ = fVar200;
    local_228._12_4_ = 0;
    fVar165 = fVar218 + (fVar165 - fVar307) * 3.0 * fVar101;
    fVar321 = fVar308 + fVar169;
    fVar294 = fVar313 + fVar199;
    fVar166 = fVar320 + fVar213;
    local_218 = fVar297 + (fVar172 - fVar161) * 3.0 * fVar101;
    fStack_214 = fVar323 + fVar170;
    fStack_210 = fVar324 + fVar163;
    fStack_20c = fVar200 + fVar309;
    local_248._0_4_ = fVar308 - fVar169;
    local_248._4_4_ = fVar313 - fVar199;
    local_248._8_4_ = fVar320 - fVar213;
    local_248._12_4_ = 0;
    local_238._0_4_ = fVar323 - fVar170;
    local_238._4_4_ = fVar324 - fVar163;
    local_238._8_4_ = fVar200 - fVar309;
    local_238._12_4_ = 0;
    local_1f8._8_4_ = fStack_38c;
    local_1f8._12_4_ = 0;
    fVar161 = (fVar308 - fStack_394) + (fVar218 - local_398);
    fVar307 = (fVar313 - fStack_390) + (fVar308 - fStack_394);
    fVar170 = (fVar320 - fStack_38c) + (fVar313 - fStack_390);
    fVar163 = (fVar320 - fStack_38c) + 0.0;
    fVar101 = (fVar323 - fStack_384) + (fVar297 - local_388);
    fVar169 = (fVar324 - fStack_380) + (fVar323 - fStack_384);
    fVar199 = (fVar200 - fStack_37c) + (fVar324 - fStack_380);
    fVar213 = (fVar200 - fStack_37c) + 0.0;
    auVar192._0_8_ =
         CONCAT44(fStack_384 * fVar307 - fStack_394 * fVar169,
                  local_388 * fVar161 - local_398 * fVar101);
    auVar192._8_4_ = fStack_380 * fVar170 - fStack_390 * fVar199;
    auVar192._12_4_ = fStack_37c * fVar163 - fStack_38c * fVar213;
    auVar134._0_4_ = fVar102 * fVar161 - fVar265 * fVar101;
    auVar134._4_4_ = fVar123 * fVar307 - fVar251 * fVar169;
    auVar134._8_4_ = fStack_530 * fVar170 - fVar310 * fVar199;
    auVar134._12_4_ = fStack_52c * fVar163 - fVar318 * fVar213;
    auVar150._0_8_ =
         CONCAT44(local_1e8._4_4_ * fVar307 - fVar169 * fVar125,
                  local_1e8._0_4_ * fVar161 - fVar101 * fVar103);
    auVar150._8_4_ = local_1e8._8_4_ * fVar170 - fVar199 * fVar144;
    auVar150._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
    auVar330._0_4_ = fVar161 * fStack_384 - fVar101 * fStack_394;
    auVar330._4_4_ = fVar307 * fStack_380 - fVar169 * fStack_390;
    auVar330._8_4_ = fVar170 * fStack_37c - fVar199 * fStack_38c;
    auVar330._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
    auVar94._0_8_ =
         CONCAT44(fVar323 * fVar307 - fVar308 * fVar169,fVar297 * fVar161 - fVar218 * fVar101);
    auVar94._8_4_ = fVar324 * fVar170 - fVar313 * fVar199;
    auVar94._12_4_ = fVar200 * fVar163 - fVar320 * fVar213;
    auVar286._0_4_ = local_218 * fVar161 - fVar165 * fVar101;
    auVar286._4_4_ = fStack_214 * fVar307 - fVar321 * fVar169;
    auVar286._8_4_ = fStack_210 * fVar170 - fVar294 * fVar199;
    auVar286._12_4_ = fStack_20c * fVar163 - fVar166 * fVar213;
    auVar242._0_8_ =
         CONCAT44(local_238._4_4_ * fVar307 - fVar169 * local_248._4_4_,
                  local_238._0_4_ * fVar161 - fVar101 * local_248._0_4_);
    auVar242._8_4_ = local_238._8_4_ * fVar170 - fVar199 * local_248._8_4_;
    auVar242._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
    auVar273._0_4_ = fVar161 * fVar323 - fVar101 * fVar308;
    auVar273._4_4_ = fVar307 * fVar324 - fVar169 * fVar313;
    auVar273._8_4_ = fVar170 * fVar200 - fVar199 * fVar320;
    auVar273._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
    auVar325._8_4_ = auVar192._8_4_;
    auVar325._0_8_ = auVar192._0_8_;
    auVar325._12_4_ = auVar192._12_4_;
    auVar258 = minps(auVar325,auVar134);
    auVar127 = maxps(auVar192,auVar134);
    auVar135._8_4_ = auVar150._8_4_;
    auVar135._0_8_ = auVar150._0_8_;
    auVar135._12_4_ = auVar150._12_4_;
    auVar73 = minps(auVar135,auVar330);
    auVar326 = minps(auVar258,auVar73);
    auVar73 = maxps(auVar150,auVar330);
    auVar129 = maxps(auVar127,auVar73);
    auVar136._8_4_ = auVar94._8_4_;
    auVar136._0_8_ = auVar94._0_8_;
    auVar136._12_4_ = auVar94._12_4_;
    auVar127 = minps(auVar136,auVar286);
    auVar73 = maxps(auVar94,auVar286);
    auVar151._8_4_ = auVar242._8_4_;
    auVar151._0_8_ = auVar242._0_8_;
    auVar151._12_4_ = auVar242._12_4_;
    auVar258 = minps(auVar151,auVar273);
    auVar127 = minps(auVar127,auVar258);
    auVar258 = minps(auVar326,auVar127);
    auVar127 = maxps(auVar242,auVar273);
    auVar73 = maxps(auVar73,auVar127);
    auVar73 = maxps(auVar129,auVar73);
    auVar193._0_4_ =
         -(uint)(local_268 <= auVar73._0_4_ && auVar258._0_4_ <= local_258) & local_278._0_4_;
    auVar193._4_4_ =
         -(uint)(fStack_264 <= auVar73._4_4_ && auVar258._4_4_ <= fStack_254) & local_278._4_4_;
    auVar193._8_4_ =
         -(uint)(fStack_260 <= auVar73._8_4_ && auVar258._8_4_ <= fStack_250) & local_278._8_4_;
    auVar193._12_4_ =
         -(uint)(fStack_25c <= auVar73._12_4_ && auVar258._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar60 = movmskps((int)pRVar61,auVar193);
    uVar56 = 0;
    if (iVar60 != 0) {
      fVar161 = (fVar308 - fVar218) + (fStack_394 - local_398);
      fVar307 = (fVar313 - fVar308) + (fStack_390 - fStack_394);
      fVar170 = (fVar320 - fVar313) + (fStack_38c - fStack_390);
      fVar163 = (0.0 - fVar320) + (0.0 - fStack_38c);
      fVar101 = (fVar323 - fVar297) + (fStack_384 - local_388);
      fVar169 = (fVar324 - fVar323) + (fStack_380 - fStack_384);
      fVar199 = (fVar200 - fVar324) + (fStack_37c - fStack_380);
      fVar213 = (0.0 - fVar200) + (0.0 - fStack_37c);
      auVar331._0_8_ =
           CONCAT44(fStack_384 * fVar307 - fStack_394 * fVar169,
                    local_388 * fVar161 - local_398 * fVar101);
      auVar331._8_4_ = fStack_380 * fVar170 - fStack_390 * fVar199;
      auVar331._12_4_ = fStack_37c * fVar163 - fStack_38c * fVar213;
      auVar137._0_4_ = fVar102 * fVar161 - fVar265 * fVar101;
      auVar137._4_4_ = fVar123 * fVar307 - fVar251 * fVar169;
      auVar137._8_4_ = fStack_530 * fVar170 - fVar310 * fVar199;
      auVar137._12_4_ = fStack_52c * fVar163 - fVar318 * fVar213;
      auVar227._0_8_ =
           CONCAT44(local_1e8._4_4_ * fVar307 - fVar125 * fVar169,
                    local_1e8._0_4_ * fVar161 - fVar103 * fVar101);
      auVar227._8_4_ = local_1e8._8_4_ * fVar170 - fVar144 * fVar199;
      auVar227._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
      auVar152._0_4_ = fStack_384 * fVar161 - fStack_394 * fVar101;
      auVar152._4_4_ = fStack_380 * fVar307 - fStack_390 * fVar169;
      auVar152._8_4_ = fStack_37c * fVar170 - fStack_38c * fVar199;
      auVar152._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
      auVar315._0_8_ =
           CONCAT44(fVar323 * fVar307 - fVar308 * fVar169,fVar297 * fVar161 - fVar218 * fVar101);
      auVar315._8_4_ = fVar324 * fVar170 - fVar313 * fVar199;
      auVar315._12_4_ = fVar200 * fVar163 - fVar320 * fVar213;
      auVar167._0_4_ = local_218 * fVar161 - fVar165 * fVar101;
      auVar167._4_4_ = fStack_214 * fVar307 - fVar321 * fVar169;
      auVar167._8_4_ = fStack_210 * fVar170 - fVar294 * fVar199;
      auVar167._12_4_ = fStack_20c * fVar163 - fVar166 * fVar213;
      auVar287._0_8_ =
           CONCAT44(local_238._4_4_ * fVar307 - local_248._4_4_ * fVar169,
                    local_238._0_4_ * fVar161 - local_248._0_4_ * fVar101);
      auVar287._8_4_ = local_238._8_4_ * fVar170 - local_248._8_4_ * fVar199;
      auVar287._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
      auVar274._0_4_ = fVar161 * fVar323 - fVar101 * fVar308;
      auVar274._4_4_ = fVar307 * fVar324 - fVar169 * fVar313;
      auVar274._8_4_ = fVar170 * fVar200 - fVar199 * fVar320;
      auVar274._12_4_ = fVar163 * 0.0 - fVar213 * 0.0;
      auVar95._8_4_ = auVar331._8_4_;
      auVar95._0_8_ = auVar331._0_8_;
      auVar95._12_4_ = auVar331._12_4_;
      auVar73 = minps(auVar95,auVar137);
      auVar258 = maxps(auVar331,auVar137);
      auVar138._8_4_ = auVar227._8_4_;
      auVar138._0_8_ = auVar227._0_8_;
      auVar138._12_4_ = auVar227._12_4_;
      auVar127 = minps(auVar138,auVar152);
      auVar73 = minps(auVar73,auVar127);
      auVar127 = maxps(auVar227,auVar152);
      auVar326 = maxps(auVar258,auVar127);
      auVar139._8_4_ = auVar315._8_4_;
      auVar139._0_8_ = auVar315._0_8_;
      auVar139._12_4_ = auVar315._12_4_;
      auVar127 = minps(auVar139,auVar167);
      auVar129 = maxps(auVar315,auVar167);
      auVar153._8_4_ = auVar287._8_4_;
      auVar153._0_8_ = auVar287._0_8_;
      auVar153._12_4_ = auVar287._12_4_;
      auVar258 = minps(auVar153,auVar274);
      auVar127 = minps(auVar127,auVar258);
      auVar73 = minps(auVar73,auVar127);
      auVar127 = maxps(auVar287,auVar274);
      auVar127 = maxps(auVar129,auVar127);
      auVar127 = maxps(auVar326,auVar127);
      auVar332._0_4_ =
           -(uint)(local_268 <= auVar127._0_4_ && auVar73._0_4_ <= local_258) & auVar193._0_4_;
      auVar332._4_4_ =
           -(uint)(fStack_264 <= auVar127._4_4_ && auVar73._4_4_ <= fStack_254) & auVar193._4_4_;
      auVar332._8_4_ =
           -(uint)(fStack_260 <= auVar127._8_4_ && auVar73._8_4_ <= fStack_250) & auVar193._8_4_;
      auVar332._12_4_ =
           -(uint)(fStack_25c <= auVar127._12_4_ && auVar73._12_4_ <= fStack_24c) & auVar193._12_4_;
      uVar69 = movmskps(0,auVar332);
      uVar56 = (ulong)uVar69;
    }
    if ((uint)uVar56 != 0) {
      auStack_308[uVar55] = (uint)uVar56;
      *(undefined8 *)(afStack_108 + uVar55 * 2) = local_518;
      auStack_58[uVar55] = local_548;
      uVar55 = (ulong)((int)uVar55 + 1);
    }
    do {
      if ((int)uVar55 == 0) {
        fVar143 = *(float *)(ray + k * 4 + 0x80);
        auVar122._4_4_ = -(uint)(fStack_2d4 <= fVar143);
        auVar122._0_4_ = -(uint)(local_2d8 <= fVar143);
        auVar122._8_4_ = -(uint)(fStack_2d0 <= fVar143);
        auVar122._12_4_ = -(uint)(fStack_2cc <= fVar143);
        uVar67 = movmskps((int)uVar56,auVar122);
        uVar66 = uVar66 & (uint)local_3d0 & uVar67;
        if (uVar66 == 0) {
          return;
        }
        goto LAB_00bf44c4;
      }
      uVar70 = (int)uVar55 - 1;
      uVar57 = (ulong)uVar70;
      uVar69 = auStack_308[uVar57];
      local_548 = auStack_58[uVar57];
      uVar56 = 0;
      if (uVar69 != 0) {
        for (; (uVar69 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
        }
      }
      uVar69 = uVar69 - 1 & uVar69;
      auStack_308[uVar57] = uVar69;
      if (uVar69 == 0) {
        uVar55 = (ulong)uVar70;
      }
      pRVar62 = (RTCIntersectArguments *)(uVar56 + 1);
      pRVar61 = pRVar62;
      if ((long)pRVar62 < 0) {
        pRVar61 = (RTCIntersectArguments *)((ulong)((uint)pRVar62 & 1) | (ulong)pRVar62 >> 1);
      }
      fVar101 = afStack_108[uVar57 * 2];
      fVar102 = afStack_108[uVar57 * 2 + 1];
      fVar103 = fVar101 * (1.0 - (float)uVar56 * 0.33333334) + fVar102 * (float)uVar56 * 0.33333334;
      fVar123 = fVar101 * (1.0 - (float)pRVar62 * 0.33333334) +
                fVar102 * (float)pRVar62 * 0.33333334;
      fVar125 = fVar101 * 0.0 + fVar102 * 0.0;
      fVar102 = fVar101 * 0.0 + fVar102 * 0.0;
      fVar101 = fVar123 - fVar103;
      local_518 = CONCAT44(fVar123,fVar103);
      if (0.16666667 <= fVar101) break;
      fVar294 = (float)local_548;
      fVar161 = (float)((ulong)local_548 >> 0x20);
      fVar144 = 1.0 - fVar294;
      fVar165 = 1.0 - fVar294;
      fVar169 = 1.0 - fVar161;
      fVar199 = 1.0 - fVar161;
      fVar308 = fVar202 * fVar144 + (float)local_348 * fVar294;
      fVar313 = fVar215 * fVar165 + local_348._4_4_ * fVar294;
      fVar320 = fVar202 * fVar169 + (float)uStack_340 * fVar161;
      fVar321 = fVar215 * fVar199 + uStack_340._4_4_ * fVar161;
      fVar309 = (float)local_318 * fVar144 + (float)local_358 * fVar294;
      fVar172 = local_318._4_4_ * fVar165 + local_358._4_4_ * fVar294;
      fVar164 = (float)uStack_310 * fVar169 + (float)uStack_350 * fVar161;
      fVar311 = uStack_310._4_4_ * fVar199 + uStack_350._4_4_ * fVar161;
      fVar173 = (float)local_328 * fVar144 + (float)local_368 * fVar294;
      fVar323 = local_328._4_4_ * fVar165 + local_368._4_4_ * fVar294;
      fVar200 = (float)uStack_320 * fVar169 + (float)uStack_360 * fVar161;
      fVar217 = uStack_320._4_4_ * fVar199 + uStack_360._4_4_ * fVar161;
      fVar166 = (fVar144 * (float)local_338 + fVar294 * (float)local_378) - fVar173;
      fVar307 = (fVar165 * local_338._4_4_ + fVar294 * local_378._4_4_) - fVar323;
      fVar170 = (fVar169 * (float)uStack_330 + fVar161 * (float)uStack_370) - fVar200;
      fVar163 = (fVar199 * uStack_330._4_4_ + fVar161 * uStack_370._4_4_) - fVar217;
      fVar144 = fVar103 * (fVar173 - fVar309) + fVar309;
      fVar165 = fVar103 * (fVar323 - fVar172) + fVar172;
      fVar169 = fVar103 * (fVar200 - fVar164) + fVar164;
      fVar199 = fVar103 * (fVar217 - fVar311) + fVar311;
      fVar297 = (fVar173 - fVar309) * fVar123 + fVar309;
      fVar324 = (fVar323 - fVar172) * fVar123 + fVar172;
      fVar201 = (fVar200 - fVar164) * fVar123 + fVar164;
      fVar219 = (fVar217 - fVar311) * fVar123 + fVar311;
      fVar213 = fVar103 * (fVar309 - fVar308) + fVar308;
      fVar218 = fVar103 * (fVar172 - fVar313) + fVar313;
      fVar265 = fVar103 * (fVar164 - fVar320) + fVar320;
      fVar251 = fVar103 * (fVar311 - fVar321) + fVar321;
      fVar213 = (fVar144 - fVar213) * fVar103 + fVar213;
      fVar218 = (fVar165 - fVar218) * fVar103 + fVar218;
      fVar265 = (fVar169 - fVar265) * fVar103 + fVar265;
      fVar251 = (fVar199 - fVar251) * fVar103 + fVar251;
      fVar144 = (((fVar103 * fVar166 + fVar173) - fVar144) * fVar103 + fVar144) - fVar213;
      fVar165 = (((fVar103 * fVar307 + fVar323) - fVar165) * fVar103 + fVar165) - fVar218;
      fVar169 = (((fVar103 * fVar170 + fVar200) - fVar169) * fVar103 + fVar169) - fVar265;
      fVar199 = (((fVar103 * fVar163 + fVar217) - fVar199) * fVar103 + fVar199) - fVar251;
      fVar213 = fVar103 * fVar144 + fVar213;
      fVar218 = fVar103 * fVar165 + fVar218;
      fVar265 = fVar103 * fVar169 + fVar265;
      fVar251 = fVar103 * fVar199 + fVar251;
      fVar308 = (fVar309 - fVar308) * fVar123 + fVar308;
      fVar313 = (fVar172 - fVar313) * fVar123 + fVar313;
      fVar320 = (fVar164 - fVar320) * fVar123 + fVar320;
      fVar321 = (fVar311 - fVar321) * fVar123 + fVar321;
      fVar308 = (fVar297 - fVar308) * fVar123 + fVar308;
      fVar313 = (fVar324 - fVar313) * fVar123 + fVar313;
      fVar320 = (fVar201 - fVar320) * fVar123 + fVar320;
      fVar321 = (fVar219 - fVar321) * fVar123 + fVar321;
      fVar309 = (((fVar166 * fVar123 + fVar173) - fVar297) * fVar123 + fVar297) - fVar308;
      fVar172 = (((fVar307 * fVar123 + fVar323) - fVar324) * fVar123 + fVar324) - fVar313;
      fVar164 = (((fVar170 * fVar123 + fVar200) - fVar201) * fVar123 + fVar201) - fVar320;
      fVar311 = (((fVar163 * fVar123 + fVar217) - fVar219) * fVar123 + fVar219) - fVar321;
      fVar308 = fVar123 * fVar309 + fVar308;
      fVar313 = fVar123 * fVar172 + fVar313;
      fVar320 = fVar123 * fVar164 + fVar320;
      fVar321 = fVar123 * fVar311 + fVar321;
      fVar173 = fVar101 * 0.33333334;
      fVar166 = fVar144 * 3.0 * fVar173 + fVar213;
      fVar307 = fVar165 * 3.0 * fVar173 + fVar218;
      fVar170 = fVar169 * 3.0 * fVar173 + fVar265;
      fVar163 = fVar199 * 3.0 * fVar173 + fVar251;
      fVar309 = fVar308 - fVar173 * fVar309 * 3.0;
      fVar172 = fVar313 - fVar173 * fVar172 * 3.0;
      fVar164 = fVar320 - fVar173 * fVar164 * 3.0;
      fVar311 = fVar321 - fVar173 * fVar311 * 3.0;
      fVar324 = (fVar320 - fVar308) + (fVar265 - fVar213);
      fVar200 = (fVar321 - fVar313) + (fVar251 - fVar218);
      auVar243._0_4_ = fVar200 * fVar313;
      auVar243._4_4_ = fVar200 * fVar313;
      auVar243._8_4_ = fVar200 * fVar321;
      auVar243._12_4_ = fVar200 * fVar321;
      fVar144 = fVar213 * fVar324 + fVar218 * fVar200;
      fVar165 = fVar265 * fVar324 + fVar251 * fVar200;
      fVar201 = fVar166 * fVar324 + fVar307 * fVar200;
      fVar217 = fVar170 * fVar324 + fVar163 * fVar200;
      fVar173 = fVar309 * fVar324 + fVar172 * fVar200;
      auVar259._4_4_ = fVar172 * fVar324 + fVar172 * fVar200;
      auVar259._0_4_ = fVar173;
      fVar297 = fVar164 * fVar324 + fVar311 * fVar200;
      fVar169 = fVar324 * fVar308 + auVar243._0_4_;
      fVar323 = fVar324 * fVar320 + auVar243._8_4_;
      auVar22._4_8_ = auVar243._8_8_;
      auVar22._0_4_ = fVar307 * fVar324 + fVar307 * fVar200;
      auVar244._0_8_ = auVar22._0_8_ << 0x20;
      auVar244._8_4_ = fVar217;
      auVar244._12_4_ = fVar163 * fVar324 + fVar163 * fVar200;
      fVar199 = fVar201;
      if (fVar201 <= fVar144) {
        fVar199 = fVar144;
        fVar144 = fVar201;
      }
      auVar245._8_8_ = auVar244._8_8_;
      auVar245._0_8_ = auVar245._8_8_;
      auVar259._8_4_ = fVar297;
      auVar259._12_4_ = fVar311 * fVar324 + fVar311 * fVar200;
      if (fVar169 <= fVar173) {
        auVar259._0_4_ = fVar169;
      }
      if (auVar259._0_4_ <= fVar144) {
        fVar144 = auVar259._0_4_;
      }
      auVar23._4_8_ = auVar259._8_8_;
      auVar23._0_4_ = fVar324 * fVar313 + auVar243._4_4_;
      auVar260._0_8_ = auVar23._0_8_ << 0x20;
      auVar260._8_4_ = fVar323;
      auVar260._12_4_ = fVar324 * fVar321 + auVar243._12_4_;
      if (fVar169 <= fVar173) {
        fVar169 = fVar173;
      }
      auVar261._8_8_ = auVar260._8_8_;
      auVar261._0_8_ = auVar261._8_8_;
      if (fVar169 <= fVar199) {
        fVar169 = fVar199;
      }
      if (fVar217 <= fVar165) {
        auVar245._0_4_ = fVar165;
        fVar165 = fVar217;
      }
      fVar199 = fVar297;
      if (fVar323 <= fVar297) {
        fVar199 = fVar323;
      }
      if (fVar199 <= fVar165) {
        fVar165 = fVar199;
      }
      if (fVar323 <= fVar297) {
        auVar261._0_4_ = fVar297;
      }
      if (auVar261._0_4_ <= auVar245._0_4_) {
        auVar261._0_4_ = auVar245._0_4_;
      }
      bVar65 = 3 < (uint)uVar55;
      uVar24 = (undefined3)(uVar70 >> 8);
      uVar56 = (ulong)CONCAT31(uVar24,bVar65);
      fVar199 = auVar261._0_4_;
      if ((0.0001 <= fVar144) || (fVar199 <= -0.0001)) {
        if ((-0.0001 < fVar169 && fVar165 < 0.0001) ||
           ((fVar144 < 0.0001 && -0.0001 < fVar169 || (fVar165 < 0.0001 && -0.0001 < fVar199))))
        goto LAB_00bf5d42;
        bVar27 = true;
        pRVar61 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar61 >> 8),fVar101 < 0.001);
      }
      else {
LAB_00bf5d42:
        bVar65 = bVar65 || fVar101 < 0.001;
        uVar56 = (ulong)CONCAT31(uVar24,bVar65);
        fVar323 = (float)(~-(uint)(fVar144 < 0.0) & 0x3f800000 | -(uint)(fVar144 < 0.0) & 0xbf800000
                         );
        fVar297 = (float)(~-(uint)(fVar169 < 0.0) & 0x3f800000 | -(uint)(fVar169 < 0.0) & 0xbf800000
                         );
        fVar173 = 0.0;
        if ((fVar323 == fVar297) && (!NAN(fVar323) && !NAN(fVar297))) {
          fVar173 = INFINITY;
        }
        fVar324 = 0.0;
        if ((fVar323 == fVar297) && (!NAN(fVar323) && !NAN(fVar297))) {
          fVar324 = -INFINITY;
        }
        fVar200 = (float)(~-(uint)(fVar165 < 0.0) & 0x3f800000 | -(uint)(fVar165 < 0.0) & 0xbf800000
                         );
        if ((fVar323 != fVar200) || (fVar201 = fVar324, NAN(fVar323) || NAN(fVar200))) {
          if ((fVar165 != fVar144) || (NAN(fVar165) || NAN(fVar144))) {
            fVar165 = -fVar144 / (fVar165 - fVar144);
            fVar165 = (1.0 - fVar165) * 0.0 + fVar165;
            fVar201 = fVar165;
          }
          else {
            fVar165 = INFINITY;
            if ((fVar144 == 0.0) && (fVar165 = INFINITY, !NAN(fVar144))) {
              fVar165 = 0.0;
            }
            fVar201 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar144 == 0.0) & 1) * 4);
          }
          if (fVar165 <= fVar173) {
            fVar173 = fVar165;
          }
          if (fVar201 <= fVar324) {
            fVar201 = fVar324;
          }
        }
        pRVar61 = (RTCIntersectArguments *)(ulong)(fVar199 < 0.0);
        fVar144 = *(float *)(&DAT_01ff1ecc + (long)pRVar61 * 4);
        if ((fVar297 != fVar144) || (fVar165 = fVar201, NAN(fVar297) || NAN(fVar144))) {
          if ((fVar199 != fVar169) || (NAN(fVar199) || NAN(fVar169))) {
            fVar199 = -fVar169 / (fVar199 - fVar169);
            fVar199 = (1.0 - fVar199) * 0.0 + fVar199;
            fVar165 = fVar199;
          }
          else {
            fVar199 = INFINITY;
            if ((fVar169 == 0.0) && (fVar199 = INFINITY, !NAN(fVar169))) {
              fVar199 = 0.0;
            }
            pRVar61 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar169 == 0.0) & 1);
            fVar165 = *(float *)(&DAT_01ff1ec4 + (long)pRVar61 * 4);
          }
          if (fVar199 <= fVar173) {
            fVar173 = fVar199;
          }
          if (fVar165 <= fVar201) {
            fVar165 = fVar201;
          }
        }
        if ((fVar200 != fVar144) || (NAN(fVar200) || NAN(fVar144))) {
          fVar173 = (float)(~-(uint)(fVar173 < 1.0) & 0x3f800000 |
                           (uint)fVar173 & -(uint)(fVar173 < 1.0));
          fVar165 = (float)(~-(uint)(fVar165 < 1.0) & (uint)fVar165 |
                           -(uint)(fVar165 < 1.0) & 0x3f800000);
        }
        fVar173 = (float)(~-(uint)(fVar173 < 0.0) & (uint)fVar173);
        fVar144 = (float)(~-(uint)(fVar165 < 1.0) & 0x3f800000 |
                         (uint)fVar165 & -(uint)(fVar165 < 1.0));
        bVar27 = true;
        if (fVar173 <= fVar144) {
          fVar173 = fVar173 + -0.1;
          fVar144 = fVar144 + 0.1;
          uVar69 = -(uint)(fVar144 < 1.0);
          fVar173 = (float)(~-(uint)(fVar173 < 0.0) & (uint)fVar173);
          fVar201 = (float)(~uVar69 & 0x3f800000 | (uint)fVar144 & uVar69);
          fVar297 = 1.0 - fVar173;
          fVar323 = 1.0 - fVar173;
          fVar324 = 1.0 - fVar201;
          fVar200 = 1.0 - fVar201;
          fVar144 = fVar213 * fVar297 + fVar265 * fVar173;
          fVar165 = fVar218 * fVar323 + fVar251 * fVar173;
          fVar169 = fVar213 * fVar324 + fStack_530 * fVar201;
          fVar199 = fVar218 * fVar200 + fStack_52c * fVar201;
          fVar213 = fVar166 * fVar297 + fVar170 * fVar173;
          fVar218 = fVar307 * fVar323 + fVar163 * fVar173;
          fVar265 = fVar166 * fVar324 + fVar170 * fVar201;
          fVar251 = fVar307 * fVar200 + fVar163 * fVar201;
          fVar166 = fVar309 * fVar297 + fVar164 * fVar173;
          fVar307 = fVar172 * fVar323 + fVar311 * fVar173;
          fVar170 = fVar309 * fVar324 + fVar164 * fVar201;
          fVar163 = fVar172 * fVar200 + fVar311 * fVar201;
          fVar309 = fVar297 * fVar308 + fVar320 * fVar173;
          fVar172 = fVar323 * fVar313 + fVar321 * fVar173;
          fVar308 = fVar324 * fVar308 + fVar310 * fVar201;
          fVar313 = fVar200 * fVar313 + fVar318 * fVar201;
          fVar235 = fVar294 * (1.0 - fVar173) + fVar161 * fVar173;
          fStack_52c = fVar294 * (1.0 - fVar201) + fVar161 * fVar201;
          fVar101 = 1.0 / fVar101;
          auVar119._0_4_ = fVar308 - fVar309;
          auVar119._4_4_ = fVar313 - fVar172;
          auVar119._8_4_ = fVar308 - fVar308;
          auVar119._12_4_ = fVar313 - fVar313;
          auVar154._0_8_ = CONCAT44(fVar163 - fVar307,fVar170 - fVar166);
          auVar154._8_4_ = fVar170 - fVar170;
          auVar154._12_4_ = fVar163 - fVar163;
          auVar275._0_4_ = fVar265 - fVar213;
          auVar275._4_4_ = fVar251 - fVar218;
          auVar275._8_4_ = fVar265 - fVar265;
          auVar275._12_4_ = fVar251 - fVar251;
          auVar228._0_8_ = CONCAT44((fVar218 - fVar165) * 3.0,(fVar213 - fVar144) * 3.0);
          auVar228._8_4_ = (fVar265 - fVar169) * 3.0;
          auVar228._12_4_ = (fVar251 - fVar199) * 3.0;
          auVar194._0_8_ = CONCAT44((fVar307 - fVar218) * 3.0,(fVar166 - fVar213) * 3.0);
          auVar194._8_4_ = (fVar170 - fVar265) * 3.0;
          auVar194._12_4_ = (fVar163 - fVar251) * 3.0;
          auVar262._0_4_ = (fVar309 - fVar166) * 3.0;
          auVar262._4_4_ = (fVar172 - fVar307) * 3.0;
          auVar262._8_4_ = (fVar308 - fVar170) * 3.0;
          auVar262._12_4_ = (fVar313 - fVar163) * 3.0;
          auVar205._8_4_ = auVar194._8_4_;
          auVar205._0_8_ = auVar194._0_8_;
          auVar205._12_4_ = auVar194._12_4_;
          auVar127 = minps(auVar205,auVar262);
          auVar73 = maxps(auVar194,auVar262);
          auVar246._8_4_ = auVar228._8_4_;
          auVar246._0_8_ = auVar228._0_8_;
          auVar246._12_4_ = auVar228._12_4_;
          auVar129 = minps(auVar246,auVar127);
          auVar258 = maxps(auVar228,auVar73);
          auVar25._4_8_ = auVar73._8_8_;
          auVar25._0_4_ = auVar129._4_4_;
          auVar195._0_8_ = auVar25._0_8_ << 0x20;
          auVar195._8_4_ = auVar129._8_4_;
          auVar195._12_4_ = auVar129._12_4_;
          auVar196._8_8_ = auVar129._8_8_;
          auVar196._0_8_ = auVar195._8_8_;
          auVar26._4_8_ = auVar127._8_8_;
          auVar26._0_4_ = auVar258._4_4_;
          auVar206._0_8_ = auVar26._0_8_ << 0x20;
          auVar206._8_4_ = auVar258._8_4_;
          auVar206._12_4_ = auVar258._12_4_;
          auVar207._8_8_ = auVar258._8_8_;
          auVar207._0_8_ = auVar206._8_8_;
          auVar127 = minps(auVar129,auVar196);
          auVar73 = maxps(auVar258,auVar207);
          fVar324 = auVar127._0_4_ * fVar101;
          fVar200 = auVar127._4_4_ * fVar101;
          fVar201 = auVar127._8_4_ * fVar101;
          fVar217 = auVar127._12_4_ * fVar101;
          fVar161 = fVar101 * auVar73._0_4_;
          fVar170 = fVar101 * auVar73._4_4_;
          fVar309 = fVar101 * auVar73._8_4_;
          fVar101 = fVar101 * auVar73._12_4_;
          fVar297 = 1.0 / (fStack_52c - fVar235);
          auVar140._0_8_ = CONCAT44(fVar199 - fVar165,fVar169 - fVar144);
          auVar140._8_4_ = fVar169 - fVar169;
          auVar140._12_4_ = fVar199 - fVar199;
          auVar208._8_4_ = auVar140._8_4_;
          auVar208._0_8_ = auVar140._0_8_;
          auVar208._12_4_ = auVar140._12_4_;
          auVar258 = minps(auVar208,auVar275);
          auVar127 = maxps(auVar140,auVar275);
          auVar96._8_4_ = auVar154._8_4_;
          auVar96._0_8_ = auVar154._0_8_;
          auVar96._12_4_ = auVar154._12_4_;
          auVar73 = minps(auVar96,auVar119);
          auVar258 = minps(auVar258,auVar73);
          auVar73 = maxps(auVar154,auVar119);
          auVar73 = maxps(auVar127,auVar73);
          fVar311 = auVar258._0_4_ * fVar297;
          fVar173 = auVar258._4_4_ * fVar297;
          fVar323 = fVar297 * auVar73._0_4_;
          fVar297 = fVar297 * auVar73._4_4_;
          local_548 = CONCAT44(fStack_52c,fVar235);
          auVar197._4_4_ = fStack_52c;
          auVar197._0_4_ = fVar123;
          auVar197._8_4_ = fVar125;
          auVar197._12_4_ = fVar102;
          fVar144 = (fVar103 + fVar123) * 0.5;
          fVar165 = (fVar235 + fStack_52c) * 0.5;
          fVar169 = (fVar123 + fVar125) * 0.0;
          fVar199 = (fStack_52c + fVar102) * 0.0;
          fVar213 = local_118 * fVar144 + fVar202;
          fVar265 = fStack_114 * fVar144 + fVar215;
          fVar218 = fStack_110 * fVar144 + fVar277;
          fVar251 = fStack_10c * fVar144 + fVar278;
          fVar308 = local_128 * fVar144 + fVar296;
          fVar313 = fStack_124 * fVar144 + fVar306;
          fVar294 = fStack_120 * fVar144 + fVar279;
          fVar166 = fStack_11c * fVar144 + fVar289;
          fVar213 = (fVar308 - fVar213) * fVar144 + fVar213;
          fVar265 = (fVar313 - fVar265) * fVar144 + fVar265;
          fVar218 = (fVar294 - fVar218) * fVar144 + fVar218;
          fVar251 = (fVar166 - fVar251) * fVar144 + fVar251;
          fVar308 = (((local_138 * fVar144 + fVar230) - fVar308) * fVar144 + fVar308) - fVar213;
          fVar313 = (((fStack_134 * fVar144 + fVar234) - fVar313) * fVar144 + fVar313) - fVar265;
          fVar294 = (((fStack_130 * fVar144 + fVar291) - fVar294) * fVar144 + fVar294) - fVar218;
          fVar166 = (((fStack_12c * fVar144 + fVar293) - fVar166) * fVar144 + fVar166) - fVar251;
          fVar213 = fVar144 * fVar308 + fVar213;
          fVar265 = fVar144 * fVar313 + fVar265;
          fVar308 = fVar308 * 3.0;
          fVar313 = fVar313 * 3.0;
          fVar218 = (fVar144 * fVar294 + fVar218) - fVar213;
          fVar251 = (fVar144 * fVar166 + fVar251) - fVar265;
          fVar308 = (fVar294 * 3.0 - fVar308) * fVar165 + fVar308;
          fVar313 = (fVar166 * 3.0 - fVar313) * fVar165 + fVar313;
          auVar120._0_8_ = CONCAT44(fVar308,fVar218) ^ 0x80000000;
          auVar120._8_4_ = fVar308;
          auVar120._12_4_ = fVar308;
          fVar219 = fVar103 - fVar144;
          fVar220 = fVar235 - fVar165;
          fVar221 = fVar123 - fVar169;
          fVar231 = fStack_52c - fVar199;
          fVar232 = fVar123 - fVar144;
          fVar233 = fStack_52c - fVar165;
          fVar125 = fVar125 - fVar169;
          fVar102 = fVar102 - fVar199;
          fVar213 = fVar218 * fVar165 + fVar213;
          fVar265 = fVar251 * fVar165 + fVar265;
          auVar141._0_8_ = CONCAT44(fVar313,fVar251) ^ 0x8000000000000000;
          auVar141._8_4_ = -fVar313;
          auVar141._12_4_ = -fVar313;
          auVar303._0_4_ = fVar251 * fVar308 - fVar313 * fVar218;
          auVar303._4_4_ = auVar303._0_4_;
          auVar303._8_4_ = auVar303._0_4_;
          auVar303._12_4_ = auVar303._0_4_;
          auVar127 = divps(auVar141,auVar303);
          auVar73 = divps(auVar120,auVar303);
          fVar308 = auVar127._0_4_;
          fVar313 = auVar127._4_4_;
          fVar218 = auVar73._0_4_;
          fVar251 = auVar73._4_4_;
          fVar144 = fVar144 - (fVar265 * fVar218 + fVar213 * fVar308);
          fVar169 = fVar165 - (fVar265 * fVar251 + fVar213 * fVar313);
          fVar199 = fVar165 - (fVar265 * auVar73._8_4_ + fVar213 * auVar127._8_4_);
          fVar165 = fVar165 - (fVar265 * auVar73._12_4_ + fVar213 * auVar127._12_4_);
          auVar327._0_8_ = CONCAT44(fVar313 * fVar311,fVar313 * fVar324);
          auVar327._8_4_ = fVar313 * fVar200;
          auVar327._12_4_ = fVar313 * fVar173;
          auVar263._0_4_ = fVar313 * fVar161;
          auVar263._4_4_ = fVar313 * fVar323;
          auVar263._8_4_ = fVar313 * fVar170;
          auVar263._12_4_ = fVar313 * fVar297;
          auVar333._8_4_ = auVar327._8_4_;
          auVar333._0_8_ = auVar327._0_8_;
          auVar333._12_4_ = auVar327._12_4_;
          auVar129 = minps(auVar333,auVar263);
          auVar127 = maxps(auVar263,auVar327);
          auVar155._0_8_ = CONCAT44(fVar251 * fVar173,fVar251 * fVar200);
          auVar155._8_4_ = fVar251 * fVar201;
          auVar155._12_4_ = fVar251 * fVar217;
          auVar328._0_4_ = fVar251 * fVar170;
          auVar328._4_4_ = fVar251 * fVar297;
          auVar328._8_4_ = fVar251 * fVar309;
          auVar328._12_4_ = fVar251 * fVar101;
          auVar247._8_4_ = auVar155._8_4_;
          auVar247._0_8_ = auVar155._0_8_;
          auVar247._12_4_ = auVar155._12_4_;
          auVar73 = minps(auVar247,auVar328);
          auVar258 = maxps(auVar328,auVar155);
          fVar213 = 0.0 - (auVar258._0_4_ + auVar127._0_4_);
          fVar265 = 1.0 - (auVar258._4_4_ + auVar127._4_4_);
          fVar294 = 0.0 - (auVar258._8_4_ + auVar127._8_4_);
          fVar166 = 0.0 - (auVar258._12_4_ + auVar127._12_4_);
          fVar307 = 0.0 - (auVar73._0_4_ + auVar129._0_4_);
          fVar163 = 1.0 - (auVar73._4_4_ + auVar129._4_4_);
          fVar172 = 0.0 - (auVar73._8_4_ + auVar129._8_4_);
          fVar164 = 0.0 - (auVar73._12_4_ + auVar129._12_4_);
          auVar264._0_8_ = CONCAT44(fVar220 * fVar265,fVar219 * fVar213);
          auVar264._8_4_ = fVar221 * fVar294;
          auVar264._12_4_ = fVar231 * fVar166;
          auVar304._0_8_ = CONCAT44(fVar311 * fVar308,fVar324 * fVar308);
          auVar304._8_4_ = fVar200 * fVar308;
          auVar304._12_4_ = fVar173 * fVar308;
          auVar248._0_4_ = fVar308 * fVar161;
          auVar248._4_4_ = fVar308 * fVar323;
          auVar248._8_4_ = fVar308 * fVar170;
          auVar248._12_4_ = fVar308 * fVar297;
          auVar316._8_4_ = auVar304._8_4_;
          auVar316._0_8_ = auVar304._0_8_;
          auVar316._12_4_ = auVar304._12_4_;
          auVar127 = minps(auVar316,auVar248);
          auVar73 = maxps(auVar248,auVar304);
          auVar209._0_8_ = CONCAT44(fVar173 * fVar218,fVar200 * fVar218);
          auVar209._8_4_ = fVar201 * fVar218;
          auVar209._12_4_ = fVar217 * fVar218;
          auVar329._0_4_ = fVar218 * fVar170;
          auVar329._4_4_ = fVar218 * fVar297;
          auVar329._8_4_ = fVar218 * fVar309;
          auVar329._12_4_ = fVar218 * fVar101;
          auVar334._8_4_ = auVar209._8_4_;
          auVar334._0_8_ = auVar209._0_8_;
          auVar334._12_4_ = auVar209._12_4_;
          auVar129 = minps(auVar334,auVar329);
          auVar305._0_4_ = fVar219 * fVar307;
          auVar305._4_4_ = fVar220 * fVar163;
          auVar305._8_4_ = fVar221 * fVar172;
          auVar305._12_4_ = fVar231 * fVar164;
          auVar156._0_8_ = CONCAT44(fVar265 * fVar233,fVar213 * fVar232);
          auVar156._8_4_ = fVar294 * fVar125;
          auVar156._12_4_ = fVar166 * fVar102;
          auVar168._0_4_ = fVar307 * fVar232;
          auVar168._4_4_ = fVar163 * fVar233;
          auVar168._8_4_ = fVar172 * fVar125;
          auVar168._12_4_ = fVar164 * fVar102;
          auVar258 = maxps(auVar329,auVar209);
          fVar101 = 1.0 - (auVar258._0_4_ + auVar73._0_4_);
          fVar213 = 0.0 - (auVar258._4_4_ + auVar73._4_4_);
          fVar265 = 0.0 - (auVar258._8_4_ + auVar73._8_4_);
          fVar294 = 0.0 - (auVar258._12_4_ + auVar73._12_4_);
          fVar166 = 1.0 - (auVar129._0_4_ + auVar127._0_4_);
          fVar161 = 0.0 - (auVar129._4_4_ + auVar127._4_4_);
          fVar307 = 0.0 - (auVar129._8_4_ + auVar127._8_4_);
          fVar170 = 0.0 - (auVar129._12_4_ + auVar127._12_4_);
          auVar249._0_8_ = CONCAT44(fVar220 * fVar213,fVar219 * fVar101);
          auVar249._8_4_ = fVar221 * fVar265;
          auVar249._12_4_ = fVar231 * fVar294;
          auVar276._0_4_ = fVar219 * fVar166;
          auVar276._4_4_ = fVar220 * fVar161;
          auVar276._8_4_ = fVar221 * fVar307;
          auVar276._12_4_ = fVar231 * fVar170;
          auVar210._0_8_ = CONCAT44(fVar213 * fVar233,fVar101 * fVar232);
          auVar210._8_4_ = fVar265 * fVar125;
          auVar210._12_4_ = fVar294 * fVar102;
          auVar229._0_4_ = fVar166 * fVar232;
          auVar229._4_4_ = fVar161 * fVar233;
          auVar229._8_4_ = fVar307 * fVar125;
          auVar229._12_4_ = fVar170 * fVar102;
          auVar288._8_4_ = auVar249._8_4_;
          auVar288._0_8_ = auVar249._0_8_;
          auVar288._12_4_ = auVar249._12_4_;
          auVar73 = minps(auVar288,auVar276);
          auVar317._8_4_ = auVar210._8_4_;
          auVar317._0_8_ = auVar210._0_8_;
          auVar317._12_4_ = auVar210._12_4_;
          auVar127 = minps(auVar317,auVar229);
          auVar129 = minps(auVar73,auVar127);
          auVar127 = maxps(auVar276,auVar249);
          auVar73 = maxps(auVar229,auVar210);
          auVar258 = maxps(auVar73,auVar127);
          auVar211._8_4_ = auVar264._8_4_;
          auVar211._0_8_ = auVar264._0_8_;
          auVar211._12_4_ = auVar264._12_4_;
          auVar73 = minps(auVar211,auVar305);
          auVar250._8_4_ = auVar156._8_4_;
          auVar250._0_8_ = auVar156._0_8_;
          auVar250._12_4_ = auVar156._12_4_;
          auVar127 = minps(auVar250,auVar168);
          auVar127 = minps(auVar73,auVar127);
          auVar326 = maxps(auVar305,auVar264);
          auVar73 = maxps(auVar168,auVar156);
          auVar73 = maxps(auVar73,auVar326);
          auVar212._0_4_ = auVar129._4_4_ + auVar129._0_4_ + fVar144;
          auVar212._4_4_ = auVar127._4_4_ + auVar127._0_4_ + fVar169;
          auVar212._8_4_ = auVar129._8_4_ + auVar129._4_4_ + fVar199;
          auVar212._12_4_ = auVar129._12_4_ + auVar127._4_4_ + fVar165;
          fVar101 = auVar258._4_4_ + auVar258._0_4_ + fVar144;
          fVar102 = auVar73._4_4_ + auVar73._0_4_ + fVar169;
          auVar157._4_4_ = fVar102;
          auVar157._0_4_ = fVar101;
          auVar30._4_4_ = fVar235;
          auVar30._0_4_ = fVar103;
          auVar30._8_4_ = fVar123;
          auVar30._12_4_ = fStack_52c;
          auVar127 = maxps(auVar30,auVar212);
          auVar157._8_4_ = auVar258._8_4_ + auVar258._4_4_ + fVar199;
          auVar157._12_4_ = auVar258._12_4_ + auVar73._4_4_ + fVar165;
          auVar73 = minps(auVar157,auVar197);
          iVar60 = -(uint)(auVar73._0_4_ < auVar127._0_4_);
          iVar68 = -(uint)(auVar73._4_4_ < auVar127._4_4_);
          auVar159._4_4_ = iVar68;
          auVar159._0_4_ = iVar60;
          auVar159._8_4_ = iVar68;
          auVar159._12_4_ = iVar68;
          auVar158._8_8_ = auVar159._8_8_;
          auVar158._4_4_ = iVar60;
          auVar158._0_4_ = iVar60;
          uVar69 = movmskpd((int)pRVar61,auVar158);
          pRVar61 = (RTCIntersectArguments *)(ulong)uVar69;
          fStack_530 = fVar123;
          if (uVar69 == 0) {
            pRVar61 = (RTCIntersectArguments *)0x0;
            if ((fVar103 < auVar212._0_4_) && (fVar101 < fVar123)) {
              iVar60 = -(uint)(fVar102 < fStack_52c);
              pRVar61 = (RTCIntersectArguments *)
                        (ulong)CONCAT11((char)((uint)iVar60 >> 8),
                                        (byte)iVar60 & fVar235 < auVar212._4_4_);
            }
            bVar53 = bVar65 | (byte)pRVar61;
            uVar56 = (ulong)CONCAT31(uVar24,bVar53);
            if (bVar53 == 1) {
              uVar56 = 200;
              do {
                fVar102 = 1.0 - fVar144;
                fVar125 = fVar144 * fVar144 * fVar144;
                fVar123 = fVar144 * fVar144 * 3.0 * fVar102;
                fVar101 = fVar102 * fVar102 * fVar102;
                fVar165 = fVar144 * 3.0 * fVar102 * fVar102;
                fVar102 = fVar101 * fVar202 +
                          fVar165 * fVar296 + fVar123 * fVar230 + fVar125 * (float)local_148._0_4_;
                fVar103 = fVar101 * fVar215 +
                          fVar165 * fVar306 + fVar123 * fVar234 + fVar125 * (float)local_148._4_4_;
                fVar102 = ((fVar101 * fVar277 +
                           fVar165 * fVar279 + fVar123 * fVar291 + fVar125 * fStack_140) - fVar102)
                          * fVar169 + fVar102;
                fVar103 = ((fVar101 * fVar278 +
                           fVar165 * fVar289 + fVar123 * fVar293 + fVar125 * fStack_13c) - fVar103)
                          * fVar169 + fVar103;
                fVar144 = fVar144 - (fVar103 * fVar218 + fVar102 * fVar308);
                fVar169 = fVar169 - (fVar103 * fVar251 + fVar102 * fVar313);
                fVar101 = ABS(fVar103);
                if (ABS(fVar103) <= ABS(fVar102)) {
                  fVar101 = ABS(fVar102);
                }
                if (fVar101 < fVar143) {
                  if ((((0.0 <= fVar144) && (fVar144 <= 1.0)) && (0.0 <= fVar169)) &&
                     (fVar169 <= 1.0)) {
                    fVar101 = pre->ray_space[k].vx.field_0.m128[2];
                    fVar102 = pre->ray_space[k].vy.field_0.m128[2];
                    fVar103 = pre->ray_space[k].vz.field_0.m128[2];
                    fVar218 = 1.0 - fVar169;
                    fVar213 = 1.0 - fVar144;
                    fVar123 = fVar213 * fVar213 * fVar213;
                    fVar125 = fVar144 * 3.0 * fVar213 * fVar213;
                    fVar199 = fVar144 * fVar144 * fVar144;
                    fVar165 = fVar144 * fVar144 * 3.0 * fVar213;
                    fVar101 = ((fStack_150 * fVar103 + fStack_154 * fVar102 + local_158 * fVar101) *
                               fVar218 +
                              (fStack_190 * fVar103 + fStack_194 * fVar102 + local_198 * fVar101) *
                              fVar169) * fVar123 +
                              ((fStack_160 * fVar103 + fStack_164 * fVar102 + local_168 * fVar101) *
                               fVar218 +
                              (fStack_1a0 * fVar103 + fStack_1a4 * fVar102 + local_1a8 * fVar101) *
                              fVar169) * fVar125 +
                              ((fStack_170 * fVar103 + fStack_174 * fVar102 + local_178 * fVar101) *
                               fVar218 +
                              (fStack_1b0 * fVar103 + fStack_1b4 * fVar102 + local_1b8 * fVar101) *
                              fVar169) * fVar165 +
                              (fVar218 * (fStack_180 * fVar103 +
                                         fStack_184 * fVar102 + local_188 * fVar101) +
                              (fVar103 * fStack_1c0 + fVar102 * fStack_1c4 + fVar101 * local_1c8) *
                              fVar169) * fVar199;
                    if ((fVar72 <= fVar101) &&
                       (fVar102 = *(float *)(ray + k * 4 + 0x80), fVar101 <= fVar102)) {
                      fVar251 = 1.0 - fVar169;
                      fVar308 = 1.0 - fVar169;
                      fVar313 = 1.0 - fVar169;
                      fVar103 = fVar203 * fVar251 + fVar252 * fVar169;
                      fVar218 = fVar214 * fVar308 + fVar268 * fVar169;
                      fVar265 = fVar216 * fVar313 + fVar253 * fVar169;
                      fVar320 = fVar266 * fVar251 + fVar320 * fVar169;
                      fVar294 = fVar312 * fVar308 + fVar321 * fVar169;
                      fVar161 = fVar241 * fVar313 + fVar162 * fVar169;
                      fVar321 = fVar320 - fVar103;
                      fVar166 = fVar294 - fVar218;
                      fVar307 = fVar161 - fVar265;
                      fVar103 = (((fVar103 - (fVar314 * fVar251 + fVar124 * fVar169)) * fVar213 +
                                 fVar144 * fVar321) * fVar213 +
                                (fVar321 * fVar213 +
                                ((fVar251 * fVar171 + local_288 * fVar169) - fVar320) * fVar144) *
                                fVar144) * 3.0;
                      fVar218 = (((fVar218 - (fVar319 * fVar308 + fVar142 * fVar169)) * fVar213 +
                                 fVar144 * fVar166) * fVar213 +
                                (fVar166 * fVar213 +
                                ((fVar308 * fVar174 + fStack_284 * fVar169) - fVar294) * fVar144) *
                                fVar144) * 3.0;
                      fVar213 = (((fVar265 - (fVar322 * fVar313 + fVar160 * fVar169)) * fVar213 +
                                 fVar144 * fVar307) * fVar213 +
                                (fVar307 * fVar213 +
                                ((fVar313 * fVar198 + fStack_280 * fVar169) - fVar161) * fVar144) *
                                fVar144) * 3.0;
                      pGVar14 = (context->scene->geometries).items[uVar67].ptr;
                      uVar56 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                      pRVar61 = (RTCIntersectArguments *)context;
                      if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar265 = fVar123 * local_298 +
                                  fVar125 * local_2a8 + fVar165 * local_2b8 + fVar199 * local_2c8;
                        fVar251 = fVar123 * fStack_294 +
                                  fVar125 * fStack_2a4 + fVar165 * fStack_2b4 + fVar199 * fStack_2c4
                        ;
                        fVar123 = fVar123 * fStack_290 +
                                  fVar125 * fStack_2a0 + fVar165 * fStack_2b0 + fVar199 * fStack_2c0
                        ;
                        fVar125 = fVar251 * fVar103 - fVar218 * fVar265;
                        fVar165 = fVar123 * fVar218 - fVar213 * fVar251;
                        fVar103 = fVar265 * fVar213 - fVar103 * fVar123;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar101;
                          *(float *)(ray + k * 4 + 0xc0) = fVar165;
                          *(float *)(ray + k * 4 + 0xd0) = fVar103;
                          *(float *)(ray + k * 4 + 0xe0) = fVar125;
                          *(float *)(ray + k * 4 + 0xf0) = fVar144;
                          *(float *)(ray + k * 4 + 0x100) = fVar169;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_3d8;
                          *(uint *)(ray + k * 4 + 0x120) = uVar67;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          uVar69 = context->user->instPrimID[0];
                          uVar56 = (ulong)uVar69;
                          *(uint *)(ray + k * 4 + 0x140) = uVar69;
                        }
                        else {
                          local_e8._0_4_ = fVar165;
                          local_e8._4_4_ = fVar165;
                          local_e8._8_4_ = fVar165;
                          fStack_dc = fVar165;
                          local_d8 = fVar103;
                          fStack_d4 = fVar103;
                          fStack_d0 = fVar103;
                          fStack_cc = fVar103;
                          local_c8 = fVar125;
                          fStack_c4 = fVar125;
                          fStack_c0 = fVar125;
                          fStack_bc = fVar125;
                          local_b8 = fVar144;
                          fStack_b4 = fVar144;
                          fStack_b0 = fVar144;
                          fStack_ac = fVar144;
                          local_a8 = fVar169;
                          fStack_a4 = fVar169;
                          fStack_a0 = fVar169;
                          fStack_9c = fVar169;
                          local_98 = CONCAT44(uStack_2f4,local_2f8);
                          uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                          local_88 = CONCAT44(uStack_2e4,local_2e8);
                          uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                          local_78 = context->user->instID[0];
                          uStack_74 = local_78;
                          uStack_70 = local_78;
                          uStack_6c = local_78;
                          local_68 = context->user->instPrimID[0];
                          uStack_64 = local_68;
                          uStack_60 = local_68;
                          uStack_5c = local_68;
                          *(float *)(ray + k * 4 + 0x80) = fVar101;
                          local_3f8 = *local_3e8;
                          uStack_3f0 = local_3e8[1];
                          local_3c8.valid = (int *)&local_3f8;
                          local_3c8.geometryUserPtr = pGVar14->userPtr;
                          local_3c8.context = context->user;
                          local_3c8.hit = (RTCHitN *)local_e8;
                          local_3c8.N = 4;
                          p_Var58 = pGVar14->intersectionFilterN;
                          local_3c8.ray = (RTCRayN *)ray;
                          if (p_Var58 != (RTCFilterFunctionN)0x0) {
                            p_Var58 = (RTCFilterFunctionN)(*p_Var58)(&local_3c8);
                          }
                          auVar97._0_4_ = -(uint)((int)local_3f8 == 0);
                          auVar97._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                          auVar97._8_4_ = -(uint)((int)uStack_3f0 == 0);
                          auVar97._12_4_ = -(uint)(uStack_3f0._4_4_ == 0);
                          uVar69 = movmskps((int)p_Var58,auVar97);
                          pRVar59 = (RayHitK<4> *)(ulong)(uVar69 ^ 0xf);
                          if ((uVar69 ^ 0xf) == 0) {
                            auVar97 = auVar97 ^ _DAT_01febe20;
                          }
                          else {
                            pRVar61 = context->args;
                            pRVar62 = (RTCIntersectArguments *)pRVar61->filter;
                            if ((pRVar62 != (RTCIntersectArguments *)0x0) &&
                               ((((ulong)*(Scene **)&pRVar61->flags & 2) != 0 ||
                                (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                              pRVar62 = (RTCIntersectArguments *)(*(code *)pRVar62)(&local_3c8);
                            }
                            auVar121._0_4_ = -(uint)((int)local_3f8 == 0);
                            auVar121._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                            auVar121._8_4_ = -(uint)((int)uStack_3f0 == 0);
                            auVar121._12_4_ = -(uint)(uStack_3f0._4_4_ == 0);
                            auVar97 = auVar121 ^ _DAT_01febe20;
                            uVar69 = movmskps((int)pRVar62,auVar121);
                            pRVar59 = (RayHitK<4> *)(ulong)(uVar69 ^ 0xf);
                            if ((uVar69 ^ 0xf) != 0) {
                              RVar29 = *(RTCFeatureFlags *)((long)local_3c8.hit + 4);
                              uVar69 = *(uint *)((long)local_3c8.hit + 8);
                              uVar70 = *(uint *)((long)((long)local_3c8.hit + 8) + 4);
                              *(uint *)(local_3c8.ray + 0xc0) =
                                   ~auVar121._0_4_ & *(uint *)&(local_3c8.hit)->field_0x0 |
                                   *(uint *)(local_3c8.ray + 0xc0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xc4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xc4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 200) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 200) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xcc) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xcc) & auVar121._12_4_;
                              RVar29 = *(RTCFeatureFlags *)((long)((long)local_3c8.hit + 0x10) + 4);
                              uVar69 = *(uint *)((long)local_3c8.hit + 0x18);
                              uVar70 = *(uint *)((long)((long)local_3c8.hit + 0x18) + 4);
                              *(uint *)(local_3c8.ray + 0xd0) =
                                   ~auVar121._0_4_ & *(uint *)((long)local_3c8.hit + 0x10) |
                                   *(uint *)(local_3c8.ray + 0xd0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xd4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xd4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0xd8) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0xd8) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xdc) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xdc) & auVar121._12_4_;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x20))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x20))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x20))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0xe0) =
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x20))->flags |
                                   *(uint *)(local_3c8.ray + 0xe0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xe4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xe4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0xe8) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0xe8) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xec) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xec) & auVar121._12_4_;
                              RVar29 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_3c8.hit + 0x20))->filter + 4);
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x20))->intersect;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x20))->intersect + 4
                                                );
                              *(uint *)(local_3c8.ray + 0xf0) =
                                   ~auVar121._0_4_ &
                                   *(uint *)&((RTCIntersectArguments *)((long)local_3c8.hit + 0x20))
                                             ->filter |
                                   *(uint *)(local_3c8.ray + 0xf0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xf4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xf4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0xf8) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0xf8) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xfc) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xfc) & auVar121._12_4_;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x40))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x40))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x40))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0x100) =
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x40))->flags |
                                   *(uint *)(local_3c8.ray + 0x100) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x104) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x104) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0x108) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0x108) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0x10c) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0x10c) & auVar121._12_4_;
                              RVar29 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_3c8.hit + 0x40))->filter + 4);
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x40))->intersect;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x40))->intersect + 4
                                                );
                              *(uint *)(local_3c8.ray + 0x110) =
                                   *(uint *)(local_3c8.ray + 0x110) & auVar121._0_4_ |
                                   ~auVar121._0_4_ &
                                   *(uint *)&((RTCIntersectArguments *)((long)local_3c8.hit + 0x40))
                                             ->filter;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x114) =
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x114) & auVar121._4_4_ |
                                   ~auVar121._4_4_ & RVar29;
                              *(uint *)(local_3c8.ray + 0x118) =
                                   *(uint *)(local_3c8.ray + 0x118) & auVar121._8_4_ |
                                   ~auVar121._8_4_ & uVar69;
                              *(uint *)(local_3c8.ray + 0x11c) =
                                   *(uint *)(local_3c8.ray + 0x11c) & auVar121._12_4_ |
                                   ~auVar121._12_4_ & uVar70;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x60))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x60))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x60))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0x120) =
                                   *(uint *)(local_3c8.ray + 0x120) & auVar121._0_4_ |
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x60))->flags;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x124) =
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x124) & auVar121._4_4_ |
                                   ~auVar121._4_4_ & RVar29;
                              *(uint *)(local_3c8.ray + 0x128) =
                                   *(uint *)(local_3c8.ray + 0x128) & auVar121._8_4_ |
                                   ~auVar121._8_4_ & uVar69;
                              *(uint *)(local_3c8.ray + 300) =
                                   *(uint *)(local_3c8.ray + 300) & auVar121._12_4_ |
                                   ~auVar121._12_4_ & uVar70;
                              RVar29 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_3c8.hit + 0x60))->filter + 4);
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x60))->intersect;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x60))->intersect + 4
                                                );
                              *(uint *)(local_3c8.ray + 0x130) =
                                   ~auVar121._0_4_ &
                                   *(uint *)&((RTCIntersectArguments *)((long)local_3c8.hit + 0x60))
                                             ->filter |
                                   *(uint *)(local_3c8.ray + 0x130) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x134) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x134) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0x138) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0x138) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0x13c) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0x13c) & auVar121._12_4_;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x80))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x80))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x80))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0x140) =
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x80))->flags |
                                   *(uint *)(local_3c8.ray + 0x140) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x144) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x144) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0x148) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0x148) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0x14c) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0x14c) & auVar121._12_4_;
                              pRVar59 = (RayHitK<4> *)local_3c8.ray;
                              pRVar61 = (RTCIntersectArguments *)local_3c8.hit;
                            }
                          }
                          auVar98._0_4_ = auVar97._0_4_ << 0x1f;
                          auVar98._4_4_ = auVar97._4_4_ << 0x1f;
                          auVar98._8_4_ = auVar97._8_4_ << 0x1f;
                          auVar98._12_4_ = auVar97._12_4_ << 0x1f;
                          uVar69 = movmskps((int)pRVar59,auVar98);
                          uVar56 = (ulong)uVar69;
                          if (uVar69 == 0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar102;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                uVar56 = uVar56 - 1;
              } while (uVar56 != 0);
            }
            else {
              bVar27 = false;
            }
          }
        }
      }
    } while (bVar27);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }